

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  ulong uVar58;
  byte bVar59;
  byte bVar60;
  long lVar61;
  byte bVar62;
  byte unaff_R13B;
  long lVar63;
  bool bVar64;
  ulong uVar65;
  uint uVar66;
  uint uVar123;
  uint uVar124;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  uint uVar125;
  uint uVar129;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar130;
  float fVar149;
  float fVar150;
  vint4 bi_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar175;
  float fVar197;
  float fVar198;
  vint4 bi;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar199;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  vint4 ai_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar224;
  undefined1 auVar223 [32];
  vint4 ai_1;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  float fVar230;
  vint4 ai;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined4 uVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar244 [64];
  undefined1 auVar252 [64];
  float fVar255;
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  bool local_8f1;
  int local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  ulong local_808;
  uint local_7fc;
  uint local_7f8;
  undefined4 local_7f4;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined8 local_790;
  undefined4 local_788;
  float local_784;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  uint local_774;
  uint local_770;
  Primitive *local_758;
  ulong local_750;
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  ulong local_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar117 [32];
  undefined1 auVar120 [32];
  
  PVar4 = prim[1];
  uVar58 = (ulong)(byte)PVar4;
  lVar63 = uVar58 * 0x25;
  fVar230 = *(float *)(prim + lVar63 + 0x12);
  auVar74 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar63 + 6));
  auVar176._0_4_ = fVar230 * (ray->dir).field_0.m128[0];
  auVar176._4_4_ = fVar230 * (ray->dir).field_0.m128[1];
  auVar176._8_4_ = fVar230 * (ray->dir).field_0.m128[2];
  auVar176._12_4_ = fVar230 * (ray->dir).field_0.m128[3];
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar212._0_4_ = fVar230 * auVar74._0_4_;
  auVar212._4_4_ = fVar230 * auVar74._4_4_;
  auVar212._8_4_ = fVar230 * auVar74._8_4_;
  auVar212._12_4_ = fVar230 * auVar74._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar58 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar225._4_4_ = auVar176._0_4_;
  auVar225._0_4_ = auVar176._0_4_;
  auVar225._8_4_ = auVar176._0_4_;
  auVar225._12_4_ = auVar176._0_4_;
  auVar79 = vshufps_avx(auVar176,auVar176,0x55);
  auVar18 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar230 = auVar18._0_4_;
  auVar177._0_4_ = fVar230 * auVar68._0_4_;
  fVar242 = auVar18._4_4_;
  auVar177._4_4_ = fVar242 * auVar68._4_4_;
  fVar245 = auVar18._8_4_;
  auVar177._8_4_ = fVar245 * auVar68._8_4_;
  fVar247 = auVar18._12_4_;
  auVar177._12_4_ = fVar247 * auVar68._12_4_;
  auVar155._0_4_ = auVar69._0_4_ * fVar230;
  auVar155._4_4_ = auVar69._4_4_ * fVar242;
  auVar155._8_4_ = auVar69._8_4_ * fVar245;
  auVar155._12_4_ = auVar69._12_4_ * fVar247;
  auVar131._0_4_ = auVar70._0_4_ * fVar230;
  auVar131._4_4_ = auVar70._4_4_ * fVar242;
  auVar131._8_4_ = auVar70._8_4_ * fVar245;
  auVar131._12_4_ = auVar70._12_4_ * fVar247;
  auVar18 = vfmadd231ps_fma(auVar177,auVar79,auVar74);
  auVar24 = vfmadd231ps_fma(auVar155,auVar79,auVar77);
  auVar79 = vfmadd231ps_fma(auVar131,auVar78,auVar79);
  auVar18 = vfmadd231ps_fma(auVar18,auVar225,auVar75);
  auVar24 = vfmadd231ps_fma(auVar24,auVar225,auVar17);
  auVar25 = vfmadd231ps_fma(auVar79,auVar76,auVar225);
  auVar260._4_4_ = auVar212._0_4_;
  auVar260._0_4_ = auVar212._0_4_;
  auVar260._8_4_ = auVar212._0_4_;
  auVar260._12_4_ = auVar212._0_4_;
  auVar79 = vshufps_avx(auVar212,auVar212,0x55);
  auVar67 = vshufps_avx512vl(auVar212,auVar212,0xaa);
  auVar68 = vmulps_avx512vl(auVar67,auVar68);
  auVar69 = vmulps_avx512vl(auVar67,auVar69);
  auVar70 = vmulps_avx512vl(auVar67,auVar70);
  auVar74 = vfmadd231ps_fma(auVar68,auVar79,auVar74);
  auVar68 = vfmadd231ps_fma(auVar69,auVar79,auVar77);
  auVar77 = vfmadd231ps_fma(auVar70,auVar79,auVar78);
  auVar26 = vfmadd231ps_fma(auVar74,auVar260,auVar75);
  auVar131 = vfmadd231ps_fma(auVar68,auVar260,auVar17);
  auVar239._8_4_ = 0x7fffffff;
  auVar239._0_8_ = 0x7fffffff7fffffff;
  auVar239._12_4_ = 0x7fffffff;
  auVar132 = vfmadd231ps_fma(auVar77,auVar260,auVar76);
  auVar75 = vandps_avx(auVar239,auVar18);
  auVar234._8_4_ = 0x219392ef;
  auVar234._0_8_ = 0x219392ef219392ef;
  auVar234._12_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar75,auVar234,1);
  bVar64 = (bool)((byte)uVar65 & 1);
  auVar71._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar18._0_4_;
  bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar18._4_4_;
  bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar18._8_4_;
  bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar18._12_4_;
  auVar75 = vandps_avx(auVar239,auVar24);
  uVar65 = vcmpps_avx512vl(auVar75,auVar234,1);
  bVar64 = (bool)((byte)uVar65 & 1);
  auVar72._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar24._0_4_;
  bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar24._4_4_;
  bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar24._8_4_;
  bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar24._12_4_;
  auVar75 = vandps_avx(auVar239,auVar25);
  uVar65 = vcmpps_avx512vl(auVar75,auVar234,1);
  bVar64 = (bool)((byte)uVar65 & 1);
  auVar73._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar25._0_4_;
  bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar25._4_4_;
  bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar25._8_4_;
  bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar25._12_4_;
  auVar74 = vrcp14ps_avx512vl(auVar71);
  auVar235._8_4_ = 0x3f800000;
  auVar235._0_8_ = &DAT_3f8000003f800000;
  auVar235._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar71,auVar74,auVar235);
  auVar25 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar74,auVar235);
  auVar67 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar73);
  auVar75 = vfnmadd213ps_fma(auVar73,auVar74,auVar235);
  auVar23 = vfmadd132ps_fma(auVar75,auVar74,auVar74);
  fVar230 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar63 + 0x16)) *
            *(float *)(prim + lVar63 + 0x1a);
  auVar231._4_4_ = fVar230;
  auVar231._0_4_ = fVar230;
  auVar231._8_4_ = fVar230;
  auVar231._12_4_ = fVar230;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar74 = vpmovsxwd_avx(auVar74);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar17 = vsubps_avx(auVar74,auVar75);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar74 = vpmovsxwd_avx(auVar68);
  auVar68 = vfmadd213ps_fma(auVar17,auVar231,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar74);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar74 = vpmovsxwd_avx(auVar17);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar17 = vfmadd213ps_fma(auVar74,auVar231,auVar75);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar75 = vpmovsxwd_avx(auVar77);
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar65 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar58 * 2 + uVar65 + 6);
  auVar74 = vpmovsxwd_avx(auVar69);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar77 = vfmadd213ps_fma(auVar74,auVar231,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar75 = vpmovsxwd_avx(auVar76);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar74 = vpmovsxwd_avx(auVar78);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar69 = vfmadd213ps_fma(auVar74,auVar231,auVar75);
  auVar254 = ZEXT1664(auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar75 = vpmovsxwd_avx(auVar70);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar58 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar74 = vpmovsxwd_avx(auVar79);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar76 = vfmadd213ps_fma(auVar74,auVar231,auVar75);
  auVar258 = ZEXT1664(auVar76);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar58) + 6);
  auVar75 = vpmovsxwd_avx(auVar18);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar74 = vpmovsxwd_avx(auVar24);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar74 = vfmadd213ps_fma(auVar74,auVar231,auVar75);
  auVar259 = ZEXT1664(auVar74);
  auVar75 = vsubps_avx(auVar68,auVar26);
  auVar232._0_4_ = auVar25._0_4_ * auVar75._0_4_;
  auVar232._4_4_ = auVar25._4_4_ * auVar75._4_4_;
  auVar232._8_4_ = auVar25._8_4_ * auVar75._8_4_;
  auVar232._12_4_ = auVar25._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar17,auVar26);
  auVar178._0_4_ = auVar25._0_4_ * auVar75._0_4_;
  auVar178._4_4_ = auVar25._4_4_ * auVar75._4_4_;
  auVar178._8_4_ = auVar25._8_4_ * auVar75._8_4_;
  auVar178._12_4_ = auVar25._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar77,auVar131);
  auVar226._0_4_ = auVar67._0_4_ * auVar75._0_4_;
  auVar226._4_4_ = auVar67._4_4_ * auVar75._4_4_;
  auVar226._8_4_ = auVar67._8_4_ * auVar75._8_4_;
  auVar226._12_4_ = auVar67._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar69,auVar131);
  auVar156._0_4_ = auVar67._0_4_ * auVar75._0_4_;
  auVar156._4_4_ = auVar67._4_4_ * auVar75._4_4_;
  auVar156._8_4_ = auVar67._8_4_ * auVar75._8_4_;
  auVar156._12_4_ = auVar67._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar76,auVar132);
  auVar213._0_4_ = auVar23._0_4_ * auVar75._0_4_;
  auVar213._4_4_ = auVar23._4_4_ * auVar75._4_4_;
  auVar213._8_4_ = auVar23._8_4_ * auVar75._8_4_;
  auVar213._12_4_ = auVar23._12_4_ * auVar75._12_4_;
  auVar75 = vsubps_avx(auVar74,auVar132);
  auVar132._0_4_ = auVar23._0_4_ * auVar75._0_4_;
  auVar132._4_4_ = auVar23._4_4_ * auVar75._4_4_;
  auVar132._8_4_ = auVar23._8_4_ * auVar75._8_4_;
  auVar132._12_4_ = auVar23._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar232,auVar178);
  auVar74 = vpminsd_avx(auVar226,auVar156);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx(auVar213,auVar132);
  uVar238 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar25._4_4_ = uVar238;
  auVar25._0_4_ = uVar238;
  auVar25._8_4_ = uVar238;
  auVar25._12_4_ = uVar238;
  auVar74 = vmaxps_avx512vl(auVar74,auVar25);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  local_4f0 = vmulps_avx512vl(auVar75,auVar67);
  auVar75 = vpmaxsd_avx(auVar232,auVar178);
  auVar74 = vpmaxsd_avx(auVar226,auVar156);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx(auVar213,auVar132);
  fVar230 = ray->tfar;
  auVar23._4_4_ = fVar230;
  auVar23._0_4_ = fVar230;
  auVar23._8_4_ = fVar230;
  auVar23._12_4_ = fVar230;
  auVar74 = vminps_avx512vl(auVar74,auVar23);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar26);
  auVar74 = vpbroadcastd_avx512vl();
  uVar19 = vcmpps_avx512vl(local_4f0,auVar75,2);
  local_5a8 = vpcmpgtd_avx512vl(auVar74,_DAT_01ff0cf0);
  local_5a8 = ((byte)uVar19 & 0xf) & local_5a8;
  bVar64 = (char)local_5a8 == '\0';
  local_8f1 = !bVar64;
  if (bVar64) {
    return local_8f1;
  }
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar261 = ZEXT3264(auVar80);
  local_758 = prim;
LAB_01c302c5:
  lVar63 = 0;
  for (uVar65 = local_5a8; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar63 = lVar63 + 1;
  }
  local_868 = (ulong)*(uint *)(prim + 2);
  local_748 = (ulong)*(uint *)(prim + lVar63 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_868].ptr;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_748 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar230 = (pGVar5->time_range).lower;
  fVar230 = pGVar5->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar230) / ((pGVar5->time_range).upper - fVar230));
  auVar75 = vroundss_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),9);
  auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar75 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
  fVar230 = fVar230 - auVar75._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)auVar75._0_4_ * 0x38;
  lVar63 = *(long *)(_Var6 + 0x10 + lVar61);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar61);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar7 + uVar65 * lVar8);
  auVar179._0_4_ = fVar230 * *pfVar1;
  auVar179._4_4_ = fVar230 * pfVar1[1];
  auVar179._8_4_ = fVar230 * pfVar1[2];
  auVar179._12_4_ = fVar230 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar65 + 1) * lVar8);
  auVar201._0_4_ = fVar230 * *pfVar1;
  auVar201._4_4_ = fVar230 * pfVar1[1];
  auVar201._8_4_ = fVar230 * pfVar1[2];
  auVar201._12_4_ = fVar230 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar65 + 2) * lVar8);
  auVar214._0_4_ = fVar230 * *pfVar1;
  auVar214._4_4_ = fVar230 * pfVar1[1];
  auVar214._8_4_ = fVar230 * pfVar1[2];
  auVar214._12_4_ = fVar230 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar65 + 3));
  auVar157._0_4_ = fVar230 * *pfVar1;
  auVar157._4_4_ = fVar230 * pfVar1[1];
  auVar157._8_4_ = fVar230 * pfVar1[2];
  auVar157._12_4_ = fVar230 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar61);
  fVar230 = 1.0 - fVar230;
  auVar133._4_4_ = fVar230;
  auVar133._0_4_ = fVar230;
  auVar133._8_4_ = fVar230;
  auVar133._12_4_ = fVar230;
  auVar68 = vfmadd231ps_fma(auVar179,auVar133,*(undefined1 (*) [16])(lVar7 + lVar63 * uVar65));
  auVar17 = vfmadd231ps_fma(auVar201,auVar133,*(undefined1 (*) [16])(lVar7 + lVar63 * (uVar65 + 1)))
  ;
  auVar77 = vfmadd231ps_fma(auVar214,auVar133,*(undefined1 (*) [16])(lVar7 + lVar63 * (uVar65 + 2)))
  ;
  auVar69 = vfmadd231ps_fma(auVar157,auVar133,*(undefined1 (*) [16])(lVar7 + lVar63 * (uVar65 + 3)))
  ;
  auVar227._0_4_ = auVar68._0_4_ + auVar17._0_4_ + auVar77._0_4_ + auVar69._0_4_;
  auVar227._4_4_ = auVar68._4_4_ + auVar17._4_4_ + auVar77._4_4_ + auVar69._4_4_;
  auVar227._8_4_ = auVar68._8_4_ + auVar17._8_4_ + auVar77._8_4_ + auVar69._8_4_;
  auVar227._12_4_ = auVar68._12_4_ + auVar17._12_4_ + auVar77._12_4_ + auVar69._12_4_;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar27._8_4_ = 0x3e800000;
  auVar27._0_8_ = 0x3e8000003e800000;
  auVar27._12_4_ = 0x3e800000;
  auVar75 = vmulps_avx512vl(auVar227,auVar27);
  auVar75 = vsubps_avx(auVar75,(undefined1  [16])aVar2);
  auVar75 = vdpps_avx(auVar75,(undefined1  [16])aVar3,0x7f);
  auVar74 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar78 = ZEXT816(0) << 0x40;
  auVar252 = ZEXT1664(auVar78);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = auVar74._0_4_;
  auVar76 = vrcp14ss_avx512f(auVar78,auVar240);
  auVar74 = vfnmadd213ss_fma(auVar76,auVar74,ZEXT416(0x40000000));
  fVar230 = auVar75._0_4_ * auVar76._0_4_ * auVar74._0_4_;
  local_620 = ZEXT416((uint)fVar230);
  auVar228._4_4_ = fVar230;
  auVar228._0_4_ = fVar230;
  auVar228._8_4_ = fVar230;
  auVar228._12_4_ = fVar230;
  fStack_730 = fVar230;
  _local_740 = auVar228;
  fStack_72c = fVar230;
  fStack_728 = fVar230;
  fStack_724 = fVar230;
  auVar75 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar228);
  auVar75 = vblendps_avx(auVar75,auVar78,8);
  auVar74 = vsubps_avx(auVar68,auVar75);
  auVar68 = vsubps_avx(auVar77,auVar75);
  uVar238 = *(undefined4 *)&(ray->dir).field_0;
  local_460._4_4_ = uVar238;
  local_460._0_4_ = uVar238;
  local_460._8_4_ = uVar238;
  local_460._12_4_ = uVar238;
  local_460._16_4_ = uVar238;
  local_460._20_4_ = uVar238;
  local_460._24_4_ = uVar238;
  local_460._28_4_ = uVar238;
  auVar241 = ZEXT3264(local_460);
  uVar238 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_480._4_4_ = uVar238;
  local_480._0_4_ = uVar238;
  local_480._8_4_ = uVar238;
  local_480._12_4_ = uVar238;
  local_480._16_4_ = uVar238;
  local_480._20_4_ = uVar238;
  local_480._24_4_ = uVar238;
  local_480._28_4_ = uVar238;
  auVar244 = ZEXT3264(local_480);
  local_4a0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_49c = local_4a0;
  uStack_498 = local_4a0;
  uStack_494 = local_4a0;
  uStack_490 = local_4a0;
  uStack_48c = local_4a0;
  uStack_488 = local_4a0;
  uStack_484 = local_4a0;
  auVar17 = vsubps_avx(auVar17,auVar75);
  auVar75 = vsubps_avx(auVar69,auVar75);
  auVar229 = ZEXT1664(auVar75);
  local_1e0 = vbroadcastss_avx512vl(auVar74);
  auVar80._8_4_ = 1;
  auVar80._0_8_ = 0x100000001;
  auVar80._12_4_ = 1;
  auVar80._16_4_ = 1;
  auVar80._20_4_ = 1;
  auVar80._24_4_ = 1;
  auVar80._28_4_ = 1;
  local_680 = ZEXT1632(auVar74);
  local_200 = vpermps_avx512vl(auVar80,local_680);
  auVar81._8_4_ = 2;
  auVar81._0_8_ = 0x200000002;
  auVar81._12_4_ = 2;
  auVar81._16_4_ = 2;
  auVar81._20_4_ = 2;
  auVar81._24_4_ = 2;
  auVar81._28_4_ = 2;
  local_220 = vpermps_avx512vl(auVar81,local_680);
  auVar82._8_4_ = 3;
  auVar82._0_8_ = 0x300000003;
  auVar82._12_4_ = 3;
  auVar82._16_4_ = 3;
  auVar82._20_4_ = 3;
  auVar82._24_4_ = 3;
  auVar82._28_4_ = 3;
  local_1a0 = vpermps_avx2(auVar82,local_680);
  local_240 = vbroadcastss_avx512vl(auVar17);
  local_6c0 = ZEXT1632(auVar17);
  local_260 = vpermps_avx512vl(auVar80,local_6c0);
  local_280 = vpermps_avx512vl(auVar81,local_6c0);
  local_2a0 = vpermps_avx512vl(auVar82,local_6c0);
  local_2c0 = vbroadcastss_avx512vl(auVar68);
  local_6a0 = ZEXT1632(auVar68);
  local_2e0 = vpermps_avx512vl(auVar80,local_6a0);
  local_300 = vpermps_avx512vl(auVar81,local_6a0);
  local_320 = vpermps_avx512vl(auVar82,local_6a0);
  local_340 = vbroadcastss_avx512vl(auVar75);
  _local_6e0 = ZEXT1632(auVar75);
  local_360 = vpermps_avx512vl(auVar80,_local_6e0);
  local_380 = vpermps_avx2(auVar81,_local_6e0);
  local_4c0 = vpermps_avx512vl(auVar82,_local_6e0);
  auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar80 = vpermps_avx2(auVar81,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                    CONCAT48(aVar3.z * aVar3.z,
                                                             CONCAT44(aVar3.y * aVar3.y,
                                                                      aVar3.x * aVar3.x)))));
  auVar75 = vfmadd231ps_fma(auVar80,local_480,local_480);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),local_460,local_460);
  vandps_avx512vl(ZEXT1632(auVar75),auVar261._0_32_);
  local_750 = 1;
  local_808 = 0;
  bVar60 = 0;
  local_640 = ZEXT816(0x3f80000000000000);
  local_1c0 = ZEXT1632(auVar75);
  local_3a0 = local_4c0;
  do {
    auVar75 = vmovshdup_avx(local_640);
    fVar230 = local_640._0_4_;
    fVar255 = auVar75._0_4_ - fVar230;
    fVar251 = fVar255 * 0.04761905;
    local_8c0._4_4_ = fVar230;
    local_8c0._0_4_ = fVar230;
    local_8c0._8_4_ = fVar230;
    local_8c0._12_4_ = fVar230;
    local_8c0._16_4_ = fVar230;
    local_8c0._20_4_ = fVar230;
    local_8c0._24_4_ = fVar230;
    local_8c0._28_4_ = fVar230;
    local_700._4_4_ = fVar255;
    local_700._0_4_ = fVar255;
    local_700._8_4_ = fVar255;
    local_700._12_4_ = fVar255;
    local_700._16_4_ = fVar255;
    local_700._20_4_ = fVar255;
    local_700._24_4_ = fVar255;
    local_700._28_4_ = fVar255;
    auVar75 = vfmadd231ps_fma(local_8c0,local_700,_DAT_02020f20);
    auVar106 = auVar211._0_32_;
    auVar80 = vsubps_avx(auVar106,ZEXT1632(auVar75));
    fVar242 = auVar80._0_4_;
    fVar247 = auVar80._4_4_;
    fVar200 = auVar80._8_4_;
    fVar224 = auVar80._12_4_;
    fVar246 = auVar80._16_4_;
    fVar248 = auVar80._20_4_;
    fVar250 = auVar80._24_4_;
    fVar130 = fVar242 * fVar242 * fVar242;
    fVar149 = fVar247 * fVar247 * fVar247;
    auVar85._4_4_ = fVar149;
    auVar85._0_4_ = fVar130;
    fVar150 = fVar200 * fVar200 * fVar200;
    auVar85._8_4_ = fVar150;
    fVar151 = fVar224 * fVar224 * fVar224;
    auVar85._12_4_ = fVar151;
    fVar152 = fVar246 * fVar246 * fVar246;
    auVar85._16_4_ = fVar152;
    fVar153 = fVar248 * fVar248 * fVar248;
    auVar85._20_4_ = fVar153;
    fVar154 = fVar250 * fVar250 * fVar250;
    auVar85._24_4_ = fVar154;
    auVar85._28_4_ = fVar255;
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar82 = vmulps_avx512vl(auVar85,auVar81);
    fVar245 = auVar75._0_4_;
    fVar249 = auVar75._4_4_;
    fVar175 = auVar75._8_4_;
    fVar243 = auVar75._12_4_;
    fVar174 = fVar245 * fVar245 * fVar245;
    fVar197 = fVar249 * fVar249 * fVar249;
    fVar198 = fVar175 * fVar175 * fVar175;
    fVar199 = fVar243 * fVar243 * fVar243;
    auVar261._0_4_ = fVar245 * fVar242;
    auVar261._4_4_ = fVar249 * fVar247;
    auVar261._8_4_ = fVar175 * fVar200;
    auVar261._12_4_ = fVar243 * fVar224;
    auVar261._16_4_ = fVar246 * 0.0;
    auVar261._20_4_ = fVar248 * 0.0;
    auVar261._28_36_ = auVar252._28_36_;
    auVar261._24_4_ = fVar250 * 0.0;
    fVar230 = auVar259._28_4_;
    auVar81 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar199,CONCAT48(fVar198,CONCAT44(fVar197,fVar174))
                                                )),auVar81);
    fVar255 = auVar81._28_4_ + fVar255;
    auVar86._4_4_ = fVar149 * 0.16666667;
    auVar86._0_4_ = fVar130 * 0.16666667;
    auVar86._8_4_ = fVar150 * 0.16666667;
    auVar86._12_4_ = fVar151 * 0.16666667;
    auVar86._16_4_ = fVar152 * 0.16666667;
    auVar86._20_4_ = fVar153 * 0.16666667;
    auVar86._24_4_ = fVar154 * 0.16666667;
    auVar86._28_4_ = fVar255;
    auVar87._4_4_ =
         (auVar261._4_4_ * fVar247 * 12.0 + auVar261._4_4_ * fVar249 * 6.0 + fVar197 + auVar82._4_4_
         ) * 0.16666667;
    auVar87._0_4_ =
         (auVar261._0_4_ * fVar242 * 12.0 + auVar261._0_4_ * fVar245 * 6.0 + fVar174 + auVar82._0_4_
         ) * 0.16666667;
    auVar87._8_4_ =
         (auVar261._8_4_ * fVar200 * 12.0 + auVar261._8_4_ * fVar175 * 6.0 + fVar198 + auVar82._8_4_
         ) * 0.16666667;
    auVar87._12_4_ =
         (auVar261._12_4_ * fVar224 * 12.0 + auVar261._12_4_ * fVar243 * 6.0 +
         fVar199 + auVar82._12_4_) * 0.16666667;
    auVar87._16_4_ =
         (auVar261._16_4_ * fVar246 * 12.0 + auVar261._16_4_ * 0.0 * 6.0 + auVar82._16_4_ + 0.0) *
         0.16666667;
    auVar87._20_4_ =
         (auVar261._20_4_ * fVar248 * 12.0 + auVar261._20_4_ * 0.0 * 6.0 + auVar82._20_4_ + 0.0) *
         0.16666667;
    auVar87._24_4_ =
         (auVar261._24_4_ * fVar250 * 12.0 + auVar261._24_4_ * 0.0 * 6.0 + auVar82._24_4_ + 0.0) *
         0.16666667;
    auVar87._28_4_ = auVar258._28_4_;
    auVar90._4_4_ =
         (auVar81._4_4_ + fVar149 + auVar261._4_4_ * fVar249 * 12.0 + auVar261._4_4_ * fVar247 * 6.0
         ) * 0.16666667;
    auVar90._0_4_ =
         (auVar81._0_4_ + fVar130 + auVar261._0_4_ * fVar245 * 12.0 + auVar261._0_4_ * fVar242 * 6.0
         ) * 0.16666667;
    auVar90._8_4_ =
         (auVar81._8_4_ + fVar150 + auVar261._8_4_ * fVar175 * 12.0 + auVar261._8_4_ * fVar200 * 6.0
         ) * 0.16666667;
    auVar90._12_4_ =
         (auVar81._12_4_ + fVar151 +
         auVar261._12_4_ * fVar243 * 12.0 + auVar261._12_4_ * fVar224 * 6.0) * 0.16666667;
    auVar90._16_4_ =
         (auVar81._16_4_ + fVar152 + auVar261._16_4_ * 0.0 * 12.0 + auVar261._16_4_ * fVar246 * 6.0)
         * 0.16666667;
    auVar90._20_4_ =
         (auVar81._20_4_ + fVar153 + auVar261._20_4_ * 0.0 * 12.0 + auVar261._20_4_ * fVar248 * 6.0)
         * 0.16666667;
    auVar90._24_4_ =
         (auVar81._24_4_ + fVar154 + auVar261._24_4_ * 0.0 * 12.0 + auVar261._24_4_ * fVar250 * 6.0)
         * 0.16666667;
    auVar90._28_4_ = fVar230;
    auVar91._28_4_ = fVar255 + auVar258._28_4_ + auVar229._28_4_;
    auVar91._0_28_ =
         ZEXT1628(CONCAT412(fVar199 * 0.16666667,
                            CONCAT48(fVar198 * 0.16666667,
                                     CONCAT44(fVar197 * 0.16666667,fVar174 * 0.16666667))));
    auVar81 = vmulps_avx512vl(local_340,auVar91);
    auVar83 = vmulps_avx512vl(local_360,auVar91);
    auVar92._4_4_ = local_380._4_4_ * fVar197 * 0.16666667;
    auVar92._0_4_ = local_380._0_4_ * fVar174 * 0.16666667;
    auVar92._8_4_ = local_380._8_4_ * fVar198 * 0.16666667;
    auVar92._12_4_ = local_380._12_4_ * fVar199 * 0.16666667;
    auVar92._16_4_ = local_380._16_4_ * 0.0;
    auVar92._20_4_ = local_380._20_4_ * 0.0;
    auVar92._24_4_ = local_380._24_4_ * 0.0;
    auVar92._28_4_ = auVar254._28_4_ + fVar230 + auVar82._28_4_ + 0.0;
    auVar82 = vmulps_avx512vl(local_3a0,auVar91);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar90,local_2c0);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar90,local_2e0);
    auVar84 = vfmadd231ps_avx512vl(auVar92,auVar90,local_300);
    auVar82 = vfmadd231ps_avx512vl(auVar82,local_320,auVar90);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,local_240);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,local_260);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,local_280);
    auVar82 = vfmadd231ps_avx512vl(auVar82,local_2a0,auVar87);
    auVar85 = vfmadd231ps_avx512vl(auVar81,auVar86,local_1e0);
    local_860 = vfmadd231ps_avx512vl(auVar83,auVar86,local_200);
    local_720 = vfmadd231ps_avx512vl(auVar84,auVar86,local_220);
    auVar74 = vfmadd231ps_fma(auVar82,local_1a0,auVar86);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar82 = vxorps_avx512vl(auVar80,auVar86);
    auVar84 = vxorps_avx512vl(ZEXT1632(auVar75),auVar86);
    auVar219._0_4_ = auVar84._0_4_ * fVar245;
    auVar219._4_4_ = auVar84._4_4_ * fVar249;
    auVar219._8_4_ = auVar84._8_4_ * fVar175;
    auVar219._12_4_ = auVar84._12_4_ * fVar243;
    auVar219._16_4_ = auVar84._16_4_ * 0.0;
    auVar219._20_4_ = auVar84._20_4_ * 0.0;
    auVar219._24_4_ = auVar84._24_4_ * 0.0;
    auVar219._28_4_ = 0;
    auVar83._8_4_ = 0x40800000;
    auVar83._0_8_ = 0x4080000040800000;
    auVar83._12_4_ = 0x40800000;
    auVar83._16_4_ = 0x40800000;
    auVar83._20_4_ = 0x40800000;
    auVar83._24_4_ = 0x40800000;
    auVar83._28_4_ = 0x40800000;
    auVar83 = vmulps_avx512vl(auVar261._0_32_,auVar83);
    auVar81 = vsubps_avx(auVar219,auVar83);
    auVar94._4_4_ = auVar82._4_4_ * fVar247 * 0.5;
    auVar94._0_4_ = auVar82._0_4_ * fVar242 * 0.5;
    auVar94._8_4_ = auVar82._8_4_ * fVar200 * 0.5;
    auVar94._12_4_ = auVar82._12_4_ * fVar224 * 0.5;
    auVar94._16_4_ = auVar82._16_4_ * fVar246 * 0.5;
    auVar94._20_4_ = auVar82._20_4_ * fVar248 * 0.5;
    auVar94._24_4_ = auVar82._24_4_ * fVar250 * 0.5;
    auVar94._28_4_ = auVar80._28_4_;
    auVar98._4_4_ = auVar81._4_4_ * 0.5;
    auVar98._0_4_ = auVar81._0_4_ * 0.5;
    auVar98._8_4_ = auVar81._8_4_ * 0.5;
    auVar98._12_4_ = auVar81._12_4_ * 0.5;
    auVar98._16_4_ = auVar81._16_4_ * 0.5;
    auVar98._20_4_ = auVar81._20_4_ * 0.5;
    auVar98._24_4_ = auVar81._24_4_ * 0.5;
    auVar98._28_4_ = auVar81._28_4_;
    auVar99._4_4_ = (fVar247 * fVar247 + auVar83._4_4_) * 0.5;
    auVar99._0_4_ = (fVar242 * fVar242 + auVar83._0_4_) * 0.5;
    auVar99._8_4_ = (fVar200 * fVar200 + auVar83._8_4_) * 0.5;
    auVar99._12_4_ = (fVar224 * fVar224 + auVar83._12_4_) * 0.5;
    auVar99._16_4_ = (fVar246 * fVar246 + auVar83._16_4_) * 0.5;
    auVar99._20_4_ = (fVar248 * fVar248 + auVar83._20_4_) * 0.5;
    auVar99._24_4_ = (fVar250 * fVar250 + auVar83._24_4_) * 0.5;
    auVar99._28_4_ = auVar241._28_4_ + auVar83._28_4_;
    fVar242 = fVar245 * fVar245 * 0.5;
    fVar245 = fVar249 * fVar249 * 0.5;
    fVar247 = fVar175 * fVar175 * 0.5;
    fVar249 = fVar243 * fVar243 * 0.5;
    auVar100._28_4_ = auVar244._28_4_;
    auVar100._0_28_ = ZEXT1628(CONCAT412(fVar249,CONCAT48(fVar247,CONCAT44(fVar245,fVar242))));
    auVar80 = vmulps_avx512vl(local_340,auVar100);
    auVar81 = vmulps_avx512vl(local_360,auVar100);
    auVar101._4_4_ = fVar245 * local_380._4_4_;
    auVar101._0_4_ = fVar242 * local_380._0_4_;
    auVar101._8_4_ = fVar247 * local_380._8_4_;
    auVar101._12_4_ = fVar249 * local_380._12_4_;
    auVar101._16_4_ = local_380._16_4_ * 0.0;
    auVar101._20_4_ = local_380._20_4_ * 0.0;
    auVar101._24_4_ = local_380._24_4_ * 0.0;
    auVar101._28_4_ = fVar230;
    auVar82 = vmulps_avx512vl(local_3a0,auVar100);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar99,local_2c0);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar99,local_2e0);
    auVar83 = vfmadd231ps_avx512vl(auVar101,auVar99,local_300);
    auVar82 = vfmadd231ps_avx512vl(auVar82,local_320,auVar99);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar98,local_240);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,local_260);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar98,local_280);
    auVar82 = vfmadd231ps_avx512vl(auVar82,local_2a0,auVar98);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar94,local_1e0);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar94,local_200);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,local_220);
    auVar75 = vfmadd231ps_fma(auVar82,local_1a0,auVar94);
    auVar107._4_4_ = auVar80._4_4_ * fVar251;
    auVar107._0_4_ = auVar80._0_4_ * fVar251;
    auVar107._8_4_ = auVar80._8_4_ * fVar251;
    auVar107._12_4_ = auVar80._12_4_ * fVar251;
    auVar107._16_4_ = auVar80._16_4_ * fVar251;
    auVar107._20_4_ = auVar80._20_4_ * fVar251;
    auVar107._24_4_ = auVar80._24_4_ * fVar251;
    auVar107._28_4_ = auVar84._28_4_;
    auVar108._4_4_ = auVar81._4_4_ * fVar251;
    auVar108._0_4_ = auVar81._0_4_ * fVar251;
    auVar108._8_4_ = auVar81._8_4_ * fVar251;
    auVar108._12_4_ = auVar81._12_4_ * fVar251;
    auVar108._16_4_ = auVar81._16_4_ * fVar251;
    auVar108._20_4_ = auVar81._20_4_ * fVar251;
    auVar108._24_4_ = auVar81._24_4_ * fVar251;
    auVar108._28_4_ = auVar81._28_4_;
    auVar258 = ZEXT3264(auVar108);
    auVar109._4_4_ = auVar83._4_4_ * fVar251;
    auVar109._0_4_ = auVar83._0_4_ * fVar251;
    auVar109._8_4_ = auVar83._8_4_ * fVar251;
    auVar109._12_4_ = auVar83._12_4_ * fVar251;
    auVar109._16_4_ = auVar83._16_4_ * fVar251;
    auVar109._20_4_ = auVar83._20_4_ * fVar251;
    auVar109._24_4_ = auVar83._24_4_ * fVar251;
    auVar109._28_4_ = auVar83._28_4_;
    auVar259 = ZEXT3264(auVar109);
    fVar230 = auVar75._0_4_ * fVar251;
    fVar242 = auVar75._4_4_ * fVar251;
    auVar102._4_4_ = fVar242;
    auVar102._0_4_ = fVar230;
    fVar245 = auVar75._8_4_ * fVar251;
    auVar102._8_4_ = fVar245;
    fVar247 = auVar75._12_4_ * fVar251;
    auVar102._12_4_ = fVar247;
    auVar102._16_4_ = fVar251 * 0.0;
    auVar102._20_4_ = fVar251 * 0.0;
    auVar102._24_4_ = fVar251 * 0.0;
    auVar102._28_4_ = local_380._28_4_;
    auVar75 = vxorps_avx512vl(local_340._0_16_,local_340._0_16_);
    auVar87 = vpermt2ps_avx512vl(auVar85,_DAT_0205fd20,ZEXT1632(auVar75));
    auVar241 = ZEXT3264(auVar87);
    auVar88 = vpermt2ps_avx512vl(local_860,_DAT_0205fd20,ZEXT1632(auVar75));
    auVar82 = ZEXT1632(auVar75);
    auVar89 = vpermt2ps_avx512vl(local_720,_DAT_0205fd20,auVar82);
    auVar220._0_4_ = fVar230 + auVar74._0_4_;
    auVar220._4_4_ = fVar242 + auVar74._4_4_;
    auVar220._8_4_ = fVar245 + auVar74._8_4_;
    auVar220._12_4_ = fVar247 + auVar74._12_4_;
    auVar220._16_4_ = fVar251 * 0.0 + 0.0;
    auVar220._20_4_ = fVar251 * 0.0 + 0.0;
    auVar220._24_4_ = fVar251 * 0.0 + 0.0;
    auVar220._28_4_ = local_380._28_4_ + 0.0;
    auVar80 = vmaxps_avx(ZEXT1632(auVar74),auVar220);
    auVar81 = vminps_avx(ZEXT1632(auVar74),auVar220);
    auVar84 = vpermt2ps_avx512vl(ZEXT1632(auVar74),_DAT_0205fd20,auVar82);
    auVar90 = vpermt2ps_avx512vl(auVar107,_DAT_0205fd20,auVar82);
    auVar91 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,auVar82);
    auVar219 = ZEXT1632(auVar75);
    auVar92 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,auVar219);
    auVar82 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar219);
    auVar93 = vsubps_avx512vl(auVar84,auVar82);
    auVar82 = vsubps_avx(auVar87,auVar85);
    auVar94 = vsubps_avx512vl(auVar88,local_860);
    auVar83 = vsubps_avx(auVar89,local_720);
    auVar229 = ZEXT3264(auVar83);
    auVar95 = vmulps_avx512vl(auVar94,auVar109);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar108,auVar83);
    auVar96 = vmulps_avx512vl(auVar83,auVar107);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar109,auVar82);
    auVar97 = vmulps_avx512vl(auVar82,auVar108);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar107,auVar94);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar95);
    auVar96 = vmulps_avx512vl(auVar83,auVar83);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar94);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar82,auVar82);
    auVar97 = vrcp14ps_avx512vl(auVar96);
    auVar98 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar106);
    auVar97 = vfmadd132ps_avx512vl(auVar98,auVar97,auVar97);
    auVar95 = vmulps_avx512vl(auVar95,auVar97);
    auVar98 = vmulps_avx512vl(auVar94,auVar92);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar91,auVar83);
    auVar99 = vmulps_avx512vl(auVar83,auVar90);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar92,auVar82);
    auVar100 = vmulps_avx512vl(auVar82,auVar91);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar90,auVar94);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar95 = vmaxps_avx512vl(auVar95,auVar97);
    auVar95 = vsqrtps_avx512vl(auVar95);
    auVar97 = vmaxps_avx512vl(auVar93,auVar84);
    auVar80 = vmaxps_avx512vl(auVar80,auVar97);
    auVar97 = vaddps_avx512vl(auVar95,auVar80);
    auVar80 = vminps_avx512vl(auVar93,auVar84);
    auVar80 = vminps_avx(auVar81,auVar80);
    auVar80 = vsubps_avx512vl(auVar80,auVar95);
    auVar84._8_4_ = 0x3f800002;
    auVar84._0_8_ = 0x3f8000023f800002;
    auVar84._12_4_ = 0x3f800002;
    auVar84._16_4_ = 0x3f800002;
    auVar84._20_4_ = 0x3f800002;
    auVar84._24_4_ = 0x3f800002;
    auVar84._28_4_ = 0x3f800002;
    auVar81 = vmulps_avx512vl(auVar97,auVar84);
    auVar93._8_4_ = 0x3f7ffffc;
    auVar93._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar93._12_4_ = 0x3f7ffffc;
    auVar93._16_4_ = 0x3f7ffffc;
    auVar93._20_4_ = 0x3f7ffffc;
    auVar93._24_4_ = 0x3f7ffffc;
    auVar93._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar80,auVar93);
    auVar103._4_4_ = auVar81._4_4_ * auVar81._4_4_;
    auVar103._0_4_ = auVar81._0_4_ * auVar81._0_4_;
    auVar103._8_4_ = auVar81._8_4_ * auVar81._8_4_;
    auVar103._12_4_ = auVar81._12_4_ * auVar81._12_4_;
    auVar103._16_4_ = auVar81._16_4_ * auVar81._16_4_;
    auVar103._20_4_ = auVar81._20_4_ * auVar81._20_4_;
    auVar103._24_4_ = auVar81._24_4_ * auVar81._24_4_;
    auVar103._28_4_ = local_8a0._28_4_;
    auVar80 = vrsqrt14ps_avx512vl(auVar96);
    auVar95._8_4_ = 0xbf000000;
    auVar95._0_8_ = 0xbf000000bf000000;
    auVar95._12_4_ = 0xbf000000;
    auVar95._16_4_ = 0xbf000000;
    auVar95._20_4_ = 0xbf000000;
    auVar95._24_4_ = 0xbf000000;
    auVar95._28_4_ = 0xbf000000;
    auVar81 = vmulps_avx512vl(auVar96,auVar95);
    auVar104._4_4_ = auVar80._4_4_ * auVar81._4_4_;
    auVar104._0_4_ = auVar80._0_4_ * auVar81._0_4_;
    auVar104._8_4_ = auVar80._8_4_ * auVar81._8_4_;
    auVar104._12_4_ = auVar80._12_4_ * auVar81._12_4_;
    auVar104._16_4_ = auVar80._16_4_ * auVar81._16_4_;
    auVar104._20_4_ = auVar80._20_4_ * auVar81._20_4_;
    auVar104._24_4_ = auVar80._24_4_ * auVar81._24_4_;
    auVar104._28_4_ = auVar81._28_4_;
    auVar81 = vmulps_avx512vl(auVar80,auVar80);
    auVar81 = vmulps_avx512vl(auVar81,auVar104);
    auVar96._8_4_ = 0x3fc00000;
    auVar96._0_8_ = 0x3fc000003fc00000;
    auVar96._12_4_ = 0x3fc00000;
    auVar96._16_4_ = 0x3fc00000;
    auVar96._20_4_ = 0x3fc00000;
    auVar96._24_4_ = 0x3fc00000;
    auVar96._28_4_ = 0x3fc00000;
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar96);
    auVar207._4_4_ = auVar81._4_4_ * auVar82._4_4_;
    auVar207._0_4_ = auVar81._0_4_ * auVar82._0_4_;
    auVar207._8_4_ = auVar81._8_4_ * auVar82._8_4_;
    auVar207._12_4_ = auVar81._12_4_ * auVar82._12_4_;
    auVar207._16_4_ = auVar81._16_4_ * auVar82._16_4_;
    auVar207._20_4_ = auVar81._20_4_ * auVar82._20_4_;
    auVar207._24_4_ = auVar81._24_4_ * auVar82._24_4_;
    auVar207._28_4_ = auVar80._28_4_;
    auVar80 = vmulps_avx512vl(auVar94,auVar81);
    auVar84 = vmulps_avx512vl(auVar83,auVar81);
    auVar93 = vsubps_avx512vl(auVar219,auVar85);
    auVar95 = vsubps_avx512vl(auVar219,local_860);
    auVar96 = vsubps_avx512vl(auVar219,local_720);
    auVar54._4_4_ = uStack_49c;
    auVar54._0_4_ = local_4a0;
    auVar54._8_4_ = uStack_498;
    auVar54._12_4_ = uStack_494;
    auVar54._16_4_ = uStack_490;
    auVar54._20_4_ = uStack_48c;
    auVar54._24_4_ = uStack_488;
    auVar54._28_4_ = uStack_484;
    auVar97 = vmulps_avx512vl(auVar54,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar97,local_480,auVar95);
    auVar97 = vfmadd231ps_avx512vl(auVar97,local_460,auVar93);
    auVar98 = vmulps_avx512vl(auVar96,auVar96);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar93);
    auVar99 = vmulps_avx512vl(auVar54,auVar84);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar80,local_480);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar207,local_460);
    auVar84 = vmulps_avx512vl(auVar96,auVar84);
    auVar80 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar93,auVar207);
    local_660 = vmulps_avx512vl(auVar99,auVar99);
    auVar84 = vsubps_avx512vl(local_1c0,local_660);
    auVar100 = vmulps_avx512vl(auVar99,auVar80);
    auVar97 = vsubps_avx512vl(auVar97,auVar100);
    auVar100 = vaddps_avx512vl(auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar80,auVar80);
    local_7c0 = vsubps_avx512vl(auVar98,auVar97);
    auVar98 = vsubps_avx512vl(local_7c0,auVar103);
    auVar101 = vmulps_avx512vl(auVar100,auVar100);
    auVar97._8_4_ = 0x40800000;
    auVar97._0_8_ = 0x4080000040800000;
    auVar97._12_4_ = 0x40800000;
    auVar97._16_4_ = 0x40800000;
    auVar97._20_4_ = 0x40800000;
    auVar97._24_4_ = 0x40800000;
    auVar97._28_4_ = 0x40800000;
    auVar97 = vmulps_avx512vl(auVar84,auVar97);
    auVar102 = vmulps_avx512vl(auVar97,auVar98);
    auVar102 = vsubps_avx512vl(auVar101,auVar102);
    uVar65 = vcmpps_avx512vl(auVar102,auVar219,5);
    bVar56 = (byte)uVar65;
    if (bVar56 == 0) {
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar102 = vsqrtps_avx512vl(auVar102);
      auVar103 = vaddps_avx512vl(auVar84,auVar84);
      auVar104 = vrcp14ps_avx512vl(auVar103);
      auVar103 = vfnmadd213ps_avx512vl(auVar103,auVar104,auVar106);
      auVar103 = vfmadd132ps_avx512vl(auVar103,auVar104,auVar104);
      auVar86 = vxorps_avx512vl(auVar100,auVar86);
      auVar86 = vsubps_avx512vl(auVar86,auVar102);
      auVar86 = vmulps_avx512vl(auVar86,auVar103);
      auVar102 = vsubps_avx512vl(auVar102,auVar100);
      auVar102 = vmulps_avx512vl(auVar102,auVar103);
      auVar103 = vfmadd213ps_avx512vl(auVar99,auVar86,auVar80);
      local_520 = vmulps_avx512vl(auVar81,auVar103);
      auVar103 = vfmadd213ps_avx512vl(auVar99,auVar102,auVar80);
      local_540 = vmulps_avx512vl(auVar81,auVar103);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar86 = vblendmps_avx512vl(auVar103,auVar86);
      auVar105._0_4_ =
           (uint)(bVar56 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar56 & 1) * local_540._0_4_;
      bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar64 * auVar86._4_4_ | (uint)!bVar64 * local_540._4_4_;
      bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar64 * auVar86._8_4_ | (uint)!bVar64 * local_540._8_4_;
      bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar64 * auVar86._12_4_ | (uint)!bVar64 * local_540._12_4_;
      bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar105._16_4_ = (uint)bVar64 * auVar86._16_4_ | (uint)!bVar64 * local_540._16_4_;
      bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar105._20_4_ = (uint)bVar64 * auVar86._20_4_ | (uint)!bVar64 * local_540._20_4_;
      bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar105._24_4_ = (uint)bVar64 * auVar86._24_4_ | (uint)!bVar64 * local_540._24_4_;
      bVar64 = SUB81(uVar65 >> 7,0);
      auVar105._28_4_ = (uint)bVar64 * auVar86._28_4_ | (uint)!bVar64 * local_540._28_4_;
      auVar206._8_4_ = 0xff800000;
      auVar206._0_8_ = 0xff800000ff800000;
      auVar206._12_4_ = 0xff800000;
      auVar206._16_4_ = 0xff800000;
      auVar206._20_4_ = 0xff800000;
      auVar206._24_4_ = 0xff800000;
      auVar206._28_4_ = 0xff800000;
      auVar86 = vblendmps_avx512vl(auVar206,auVar102);
      auVar106._0_4_ =
           (uint)(bVar56 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar102._0_4_;
      bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar64 * auVar86._4_4_ | (uint)!bVar64 * auVar102._4_4_;
      bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar64 * auVar86._8_4_ | (uint)!bVar64 * auVar102._8_4_;
      bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar64 * auVar86._12_4_ | (uint)!bVar64 * auVar102._12_4_;
      bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar64 * auVar86._16_4_ | (uint)!bVar64 * auVar102._16_4_;
      bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar64 * auVar86._20_4_ | (uint)!bVar64 * auVar102._20_4_;
      bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar64 * auVar86._24_4_ | (uint)!bVar64 * auVar102._24_4_;
      bVar64 = SUB81(uVar65 >> 7,0);
      auVar106._28_4_ = (uint)bVar64 * auVar86._28_4_ | (uint)!bVar64 * auVar102._28_4_;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_660,auVar86);
      auVar102 = vmaxps_avx512vl(local_4c0,auVar86);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      auVar102 = vmulps_avx512vl(auVar102,auVar31);
      vandps_avx512vl(auVar84,auVar86);
      uVar58 = vcmpps_avx512vl(auVar102,auVar102,1);
      uVar65 = uVar65 & uVar58;
      bVar62 = (byte)uVar65;
      if (bVar62 != 0) {
        uVar58 = vcmpps_avx512vl(auVar98,_DAT_02020f00,2);
        auVar223._8_4_ = 0xff800000;
        auVar223._0_8_ = 0xff800000ff800000;
        auVar223._12_4_ = 0xff800000;
        auVar223._16_4_ = 0xff800000;
        auVar223._20_4_ = 0xff800000;
        auVar223._24_4_ = 0xff800000;
        auVar223._28_4_ = 0xff800000;
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar98 = vblendmps_avx512vl(auVar86,auVar223);
        bVar59 = (byte)uVar58;
        uVar66 = (uint)(bVar59 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar102._0_4_;
        bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
        uVar123 = (uint)bVar64 * auVar98._4_4_ | (uint)!bVar64 * auVar102._4_4_;
        bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
        uVar124 = (uint)bVar64 * auVar98._8_4_ | (uint)!bVar64 * auVar102._8_4_;
        bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
        uVar125 = (uint)bVar64 * auVar98._12_4_ | (uint)!bVar64 * auVar102._12_4_;
        bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
        uVar126 = (uint)bVar64 * auVar98._16_4_ | (uint)!bVar64 * auVar102._16_4_;
        bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
        uVar127 = (uint)bVar64 * auVar98._20_4_ | (uint)!bVar64 * auVar102._20_4_;
        bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
        uVar128 = (uint)bVar64 * auVar98._24_4_ | (uint)!bVar64 * auVar102._24_4_;
        bVar64 = SUB81(uVar58 >> 7,0);
        uVar129 = (uint)bVar64 * auVar98._28_4_ | (uint)!bVar64 * auVar102._28_4_;
        auVar105._0_4_ = (bVar62 & 1) * uVar66 | !(bool)(bVar62 & 1) * auVar105._0_4_;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar105._4_4_ = bVar64 * uVar123 | !bVar64 * auVar105._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar105._8_4_ = bVar64 * uVar124 | !bVar64 * auVar105._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar105._12_4_ = bVar64 * uVar125 | !bVar64 * auVar105._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar105._16_4_ = bVar64 * uVar126 | !bVar64 * auVar105._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar105._20_4_ = bVar64 * uVar127 | !bVar64 * auVar105._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar105._24_4_ = bVar64 * uVar128 | !bVar64 * auVar105._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar105._28_4_ = bVar64 * uVar129 | !bVar64 * auVar105._28_4_;
        auVar86 = vblendmps_avx512vl(auVar223,auVar86);
        bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar58 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar58 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar58 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar58 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar58 >> 6) & 1);
        bVar16 = SUB81(uVar58 >> 7,0);
        auVar106._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar59 & 1) * auVar86._0_4_ | !(bool)(bVar59 & 1) * uVar66) |
             !(bool)(bVar62 & 1) * auVar106._0_4_;
        bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar106._4_4_ =
             (uint)bVar10 * ((uint)bVar64 * auVar86._4_4_ | !bVar64 * uVar123) |
             !bVar10 * auVar106._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar106._8_4_ =
             (uint)bVar64 * ((uint)bVar11 * auVar86._8_4_ | !bVar11 * uVar124) |
             !bVar64 * auVar106._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar106._12_4_ =
             (uint)bVar64 * ((uint)bVar12 * auVar86._12_4_ | !bVar12 * uVar125) |
             !bVar64 * auVar106._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar106._16_4_ =
             (uint)bVar64 * ((uint)bVar13 * auVar86._16_4_ | !bVar13 * uVar126) |
             !bVar64 * auVar106._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar106._20_4_ =
             (uint)bVar64 * ((uint)bVar14 * auVar86._20_4_ | !bVar14 * uVar127) |
             !bVar64 * auVar106._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar106._24_4_ =
             (uint)bVar64 * ((uint)bVar15 * auVar86._24_4_ | !bVar15 * uVar128) |
             !bVar64 * auVar106._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar106._28_4_ =
             (uint)bVar64 * ((uint)bVar16 * auVar86._28_4_ | !bVar16 * uVar129) |
             !bVar64 * auVar106._28_4_;
        bVar56 = (~bVar62 | bVar59) & bVar56;
      }
      auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    fVar230 = (float)local_740._0_4_;
    fVar242 = (float)local_740._4_4_;
    fVar245 = fStack_738;
    fVar247 = fStack_734;
    fVar249 = fStack_730;
    fVar200 = fStack_72c;
    fVar175 = fStack_728;
    fVar224 = fStack_724;
    if ((bVar56 & 0x7f) == 0) {
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar261 = ZEXT3264(auVar80);
LAB_01c30f9f:
      auVar254 = ZEXT3264(auVar107);
      auVar252 = ZEXT3264(auVar89);
      auVar244 = ZEXT3264(auVar88);
    }
    else {
      auVar207 = auVar211._0_32_;
      auVar75 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_620);
      auVar208._0_4_ = auVar75._0_4_;
      auVar208._4_4_ = auVar208._0_4_;
      auVar208._8_4_ = auVar208._0_4_;
      auVar208._12_4_ = auVar208._0_4_;
      auVar208._16_4_ = auVar208._0_4_;
      auVar208._20_4_ = auVar208._0_4_;
      auVar208._24_4_ = auVar208._0_4_;
      auVar208._28_4_ = auVar208._0_4_;
      auVar86 = vmaxps_avx512vl(auVar208,auVar105);
      auVar75 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_620);
      auVar221._0_4_ = auVar75._0_4_;
      auVar221._4_4_ = auVar221._0_4_;
      auVar221._8_4_ = auVar221._0_4_;
      auVar221._12_4_ = auVar221._0_4_;
      auVar221._16_4_ = auVar221._0_4_;
      auVar221._20_4_ = auVar221._0_4_;
      auVar221._24_4_ = auVar221._0_4_;
      auVar221._28_4_ = auVar221._0_4_;
      auVar98 = vminps_avx512vl(auVar221,auVar106);
      auVar96 = vmulps_avx512vl(auVar109,auVar96);
      auVar95 = vfmadd213ps_avx512vl(auVar95,auVar108,auVar96);
      auVar93 = vfmadd213ps_avx512vl(auVar93,auVar107,auVar95);
      auVar55._4_4_ = uStack_49c;
      auVar55._0_4_ = local_4a0;
      auVar55._8_4_ = uStack_498;
      auVar55._12_4_ = uStack_494;
      auVar55._16_4_ = uStack_490;
      auVar55._20_4_ = uStack_48c;
      auVar55._24_4_ = uStack_488;
      auVar55._28_4_ = uStack_484;
      auVar95 = vmulps_avx512vl(auVar55,auVar109);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_480,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_460,auVar107);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar261 = ZEXT3264(auVar96);
      vandps_avx512vl(auVar95,auVar96);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar19 = vcmpps_avx512vl(auVar96,auVar107,1);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar93 = vxorps_avx512vl(auVar93,auVar108);
      auVar109 = vrcp14ps_avx512vl(auVar95);
      auVar102 = vxorps_avx512vl(auVar95,auVar108);
      auVar103 = vfnmadd213ps_avx512vl(auVar109,auVar95,auVar207);
      auVar103 = vfmadd132ps_avx512vl(auVar103,auVar109,auVar109);
      auVar103 = vmulps_avx512vl(auVar103,auVar93);
      uVar20 = vcmpps_avx512vl(auVar95,auVar102,1);
      bVar62 = (byte)uVar19 | (byte)uVar20;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar93 = vblendmps_avx512vl(auVar103,auVar104);
      auVar110._0_4_ =
           (uint)(bVar62 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar109._0_4_;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar110._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * auVar109._4_4_;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar110._8_4_ = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * auVar109._8_4_;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar110._12_4_ = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * auVar109._12_4_;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar110._16_4_ = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * auVar109._16_4_;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar110._20_4_ = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * auVar109._20_4_;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar110._24_4_ = (uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * auVar109._24_4_;
      auVar110._28_4_ =
           (uint)(bVar62 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar109._28_4_;
      auVar93 = vmaxps_avx(auVar86,auVar110);
      uVar20 = vcmpps_avx512vl(auVar95,auVar102,6);
      bVar62 = (byte)uVar19 | (byte)uVar20;
      auVar259 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar111._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * auVar103._0_4_;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * auVar103._4_4_;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * auVar103._8_4_;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * auVar103._12_4_;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * auVar103._16_4_;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * auVar103._20_4_;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * auVar103._24_4_;
      auVar111._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar103._28_4_;
      auVar95 = vminps_avx(auVar98,auVar111);
      auVar75 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar75),auVar87);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar75),auVar88);
      auVar109 = ZEXT1632(auVar75);
      auVar98 = vsubps_avx512vl(auVar109,auVar89);
      auVar39._4_4_ = auVar98._4_4_ * auVar92._4_4_;
      auVar39._0_4_ = auVar98._0_4_ * auVar92._0_4_;
      auVar39._8_4_ = auVar98._8_4_ * auVar92._8_4_;
      auVar39._12_4_ = auVar98._12_4_ * auVar92._12_4_;
      auVar39._16_4_ = auVar98._16_4_ * auVar92._16_4_;
      auVar39._20_4_ = auVar98._20_4_ * auVar92._20_4_;
      auVar39._24_4_ = auVar98._24_4_ * auVar92._24_4_;
      auVar39._28_4_ = auVar98._28_4_;
      auVar87 = vfnmsub231ps_avx512vl(auVar39,auVar91,auVar87);
      auVar86 = vfnmadd231ps_avx512vl(auVar87,auVar90,auVar86);
      auVar87 = vmulps_avx512vl(auVar55,auVar92);
      auVar87 = vfnmsub231ps_avx512vl(auVar87,local_480,auVar91);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,local_460,auVar90);
      vandps_avx512vl(auVar87,auVar96);
      uVar19 = vcmpps_avx512vl(auVar87,auVar107,1);
      auVar86 = vxorps_avx512vl(auVar86,auVar108);
      auVar90 = vrcp14ps_avx512vl(auVar87);
      auVar107 = vxorps_avx512vl(auVar87,auVar108);
      auVar92 = vfnmadd213ps_avx512vl(auVar90,auVar87,auVar207);
      auVar75 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
      auVar258 = ZEXT1664(auVar75);
      fVar243 = auVar75._0_4_ * auVar86._0_4_;
      fVar246 = auVar75._4_4_ * auVar86._4_4_;
      auVar40._4_4_ = fVar246;
      auVar40._0_4_ = fVar243;
      fVar248 = auVar75._8_4_ * auVar86._8_4_;
      auVar40._8_4_ = fVar248;
      fVar250 = auVar75._12_4_ * auVar86._12_4_;
      auVar40._12_4_ = fVar250;
      fVar251 = auVar86._16_4_ * 0.0;
      auVar40._16_4_ = fVar251;
      fVar255 = auVar86._20_4_ * 0.0;
      auVar40._20_4_ = fVar255;
      fVar130 = auVar86._24_4_ * 0.0;
      auVar40._24_4_ = fVar130;
      auVar40._28_4_ = auVar86._28_4_;
      uVar20 = vcmpps_avx512vl(auVar87,auVar107,1);
      bVar62 = (byte)uVar19 | (byte)uVar20;
      auVar92 = vblendmps_avx512vl(auVar40,auVar104);
      auVar89._0_4_ = (uint)(bVar62 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar90._0_4_
      ;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar89._4_4_ = (uint)bVar64 * auVar92._4_4_ | (uint)!bVar64 * auVar90._4_4_;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar89._8_4_ = (uint)bVar64 * auVar92._8_4_ | (uint)!bVar64 * auVar90._8_4_;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar89._12_4_ = (uint)bVar64 * auVar92._12_4_ | (uint)!bVar64 * auVar90._12_4_;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar89._16_4_ = (uint)bVar64 * auVar92._16_4_ | (uint)!bVar64 * auVar90._16_4_;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar89._20_4_ = (uint)bVar64 * auVar92._20_4_ | (uint)!bVar64 * auVar90._20_4_;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar89._24_4_ = (uint)bVar64 * auVar92._24_4_ | (uint)!bVar64 * auVar90._24_4_;
      auVar89._28_4_ =
           (uint)(bVar62 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar90._28_4_;
      _local_5a0 = vmaxps_avx(auVar93,auVar89);
      uVar20 = vcmpps_avx512vl(auVar87,auVar107,6);
      bVar62 = (byte)uVar19 | (byte)uVar20;
      auVar88._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar243;
      bVar64 = (bool)(bVar62 >> 1 & 1);
      auVar88._4_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar246;
      bVar64 = (bool)(bVar62 >> 2 & 1);
      auVar88._8_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar248;
      bVar64 = (bool)(bVar62 >> 3 & 1);
      auVar88._12_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar250;
      bVar64 = (bool)(bVar62 >> 4 & 1);
      auVar88._16_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar251;
      bVar64 = (bool)(bVar62 >> 5 & 1);
      auVar88._20_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar255;
      bVar64 = (bool)(bVar62 >> 6 & 1);
      auVar88._24_4_ = (uint)bVar64 * 0x7f800000 | (uint)!bVar64 * (int)fVar130;
      auVar88._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar86._28_4_;
      local_3e0 = vminps_avx(auVar95,auVar88);
      auVar241 = ZEXT3264(local_3e0);
      uVar19 = vcmpps_avx512vl(_local_5a0,local_3e0,2);
      bVar56 = bVar56 & 0x7f & (byte)uVar19;
      if (bVar56 == 0) {
        auVar211 = ZEXT3264(auVar207);
        goto LAB_01c30f9f;
      }
      auVar86 = vmaxps_avx512vl(auVar109,local_8a0);
      auVar93 = vminps_avx512vl(local_520,auVar207);
      auVar47 = ZEXT412(0);
      auVar95 = ZEXT1232(auVar47) << 0x20;
      auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar47) << 0x20);
      auVar87 = vminps_avx512vl(local_540,auVar207);
      auVar258 = ZEXT3264(CONCAT428(0x3e000000,
                                    CONCAT424(0x3e000000,
                                              CONCAT420(0x3e000000,
                                                        CONCAT416(0x3e000000,
                                                                  CONCAT412(0x3e000000,
                                                                            CONCAT48(0x3e000000,
                                                                                                                                                                          
                                                  0x3e0000003e000000)))))));
      auVar41._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
      auVar41._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
      auVar41._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
      auVar41._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
      auVar41._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
      auVar41._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
      auVar41._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
      auVar41._28_4_ = auVar93._28_4_ + 7.0;
      auVar75 = vfmadd213ps_fma(auVar41,local_700,local_8c0);
      local_520 = ZEXT1632(auVar75);
      auVar93 = vmaxps_avx(auVar87,ZEXT1232(auVar47) << 0x20);
      auVar42._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar93._28_4_ + 7.0;
      auVar75 = vfmadd213ps_fma(auVar42,local_700,local_8c0);
      local_540 = ZEXT1632(auVar75);
      auVar209._0_4_ = auVar86._0_4_ * auVar86._0_4_;
      auVar209._4_4_ = auVar86._4_4_ * auVar86._4_4_;
      auVar209._8_4_ = auVar86._8_4_ * auVar86._8_4_;
      auVar209._12_4_ = auVar86._12_4_ * auVar86._12_4_;
      auVar209._16_4_ = auVar86._16_4_ * auVar86._16_4_;
      auVar209._20_4_ = auVar86._20_4_ * auVar86._20_4_;
      auVar209._24_4_ = auVar86._24_4_ * auVar86._24_4_;
      auVar209._28_4_ = 0;
      auVar93 = vsubps_avx(local_7c0,auVar209);
      auVar97 = vmulps_avx512vl(auVar97,auVar93);
      auVar112 = vsubps_avx512vl(auVar101,auVar97);
      uVar19 = vcmpps_avx512vl(auVar112,ZEXT1232(auVar47) << 0x20,5);
      bVar62 = (byte)uVar19;
      if (bVar62 == 0) {
        auVar80 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar211 = ZEXT864(0) << 0x20;
        auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar113._8_4_ = 0x7f800000;
        auVar113._0_8_ = 0x7f8000007f800000;
        auVar113._12_4_ = 0x7f800000;
        auVar113._16_4_ = 0x7f800000;
        auVar113._20_4_ = 0x7f800000;
        auVar113._24_4_ = 0x7f800000;
        auVar113._28_4_ = 0x7f800000;
        auVar114._8_4_ = 0xff800000;
        auVar114._0_8_ = 0xff800000ff800000;
        auVar114._12_4_ = 0xff800000;
        auVar114._16_4_ = 0xff800000;
        auVar114._20_4_ = 0xff800000;
        auVar114._24_4_ = 0xff800000;
        auVar114._28_4_ = 0xff800000;
      }
      else {
        auVar74 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
        uVar65 = vcmpps_avx512vl(auVar112,auVar109,5);
        auVar95 = vsqrtps_avx(auVar112);
        auVar222._0_4_ = auVar84._0_4_ + auVar84._0_4_;
        auVar222._4_4_ = auVar84._4_4_ + auVar84._4_4_;
        auVar222._8_4_ = auVar84._8_4_ + auVar84._8_4_;
        auVar222._12_4_ = auVar84._12_4_ + auVar84._12_4_;
        auVar222._16_4_ = auVar84._16_4_ + auVar84._16_4_;
        auVar222._20_4_ = auVar84._20_4_ + auVar84._20_4_;
        auVar222._24_4_ = auVar84._24_4_ + auVar84._24_4_;
        auVar222._28_4_ = auVar84._28_4_ + auVar84._28_4_;
        auVar97 = vrcp14ps_avx512vl(auVar222);
        auVar86 = vfnmadd213ps_avx512vl(auVar222,auVar97,auVar207);
        auVar75 = vfmadd132ps_fma(auVar86,auVar97,auVar97);
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar32._16_4_ = 0x80000000;
        auVar32._20_4_ = 0x80000000;
        auVar32._24_4_ = 0x80000000;
        auVar32._28_4_ = 0x80000000;
        auVar97 = vxorps_avx512vl(auVar100,auVar32);
        auVar97 = vsubps_avx(auVar97,auVar95);
        auVar43._4_4_ = auVar97._4_4_ * auVar75._4_4_;
        auVar43._0_4_ = auVar97._0_4_ * auVar75._0_4_;
        auVar43._8_4_ = auVar97._8_4_ * auVar75._8_4_;
        auVar43._12_4_ = auVar97._12_4_ * auVar75._12_4_;
        auVar43._16_4_ = auVar97._16_4_ * 0.0;
        auVar43._20_4_ = auVar97._20_4_ * 0.0;
        auVar43._24_4_ = auVar97._24_4_ * 0.0;
        auVar43._28_4_ = 0x3e000000;
        auVar258 = ZEXT3264(auVar43);
        auVar95 = vsubps_avx512vl(auVar95,auVar100);
        auVar44._4_4_ = auVar95._4_4_ * auVar75._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar75._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar75._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar75._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * 0.0;
        auVar44._20_4_ = auVar95._20_4_ * 0.0;
        auVar44._24_4_ = auVar95._24_4_ * 0.0;
        auVar44._28_4_ = 0x7f800000;
        auVar259 = ZEXT3264(auVar44);
        auVar95 = vfmadd213ps_avx512vl(auVar99,auVar43,auVar80);
        auVar45._4_4_ = auVar81._4_4_ * auVar95._4_4_;
        auVar45._0_4_ = auVar81._0_4_ * auVar95._0_4_;
        auVar45._8_4_ = auVar81._8_4_ * auVar95._8_4_;
        auVar45._12_4_ = auVar81._12_4_ * auVar95._12_4_;
        auVar45._16_4_ = auVar81._16_4_ * auVar95._16_4_;
        auVar45._20_4_ = auVar81._20_4_ * auVar95._20_4_;
        auVar45._24_4_ = auVar81._24_4_ * auVar95._24_4_;
        auVar45._28_4_ = auVar97._28_4_;
        auVar95 = vmulps_avx512vl(local_460,auVar43);
        auVar86 = vmulps_avx512vl(local_480,auVar43);
        auVar87 = vmulps_avx512vl(auVar55,auVar43);
        auVar97 = vfmadd213ps_avx512vl(auVar82,auVar45,auVar85);
        auVar97 = vsubps_avx512vl(auVar95,auVar97);
        auVar95 = vfmadd213ps_avx512vl(auVar94,auVar45,local_860);
        auVar86 = vsubps_avx512vl(auVar86,auVar95);
        auVar75 = vfmadd213ps_fma(auVar45,auVar83,local_720);
        auVar95 = vsubps_avx(auVar87,ZEXT1632(auVar75));
        auVar244 = ZEXT3264(auVar95);
        auVar80 = vfmadd213ps_avx512vl(auVar99,auVar44,auVar80);
        auVar81 = vmulps_avx512vl(auVar81,auVar80);
        auVar80 = vmulps_avx512vl(local_460,auVar44);
        auVar87 = vmulps_avx512vl(local_480,auVar44);
        auVar90 = vmulps_avx512vl(auVar55,auVar44);
        auVar75 = vfmadd213ps_fma(auVar82,auVar81,auVar85);
        auVar95 = vsubps_avx(auVar80,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar94,auVar81,local_860);
        auVar80 = vsubps_avx512vl(auVar87,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar83,auVar81,local_720);
        auVar81 = vsubps_avx512vl(auVar90,ZEXT1632(auVar75));
        auVar211 = ZEXT3264(auVar81);
        auVar140._8_4_ = 0x7f800000;
        auVar140._0_8_ = 0x7f8000007f800000;
        auVar140._12_4_ = 0x7f800000;
        auVar140._16_4_ = 0x7f800000;
        auVar140._20_4_ = 0x7f800000;
        auVar140._24_4_ = 0x7f800000;
        auVar140._28_4_ = 0x7f800000;
        auVar81 = vblendmps_avx512vl(auVar140,auVar43);
        bVar64 = (bool)((byte)uVar65 & 1);
        auVar113._0_4_ = (uint)bVar64 * auVar81._0_4_ | (uint)!bVar64 * auVar85._0_4_;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * auVar85._4_4_;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * auVar85._8_4_;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * auVar85._12_4_;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar113._16_4_ = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * auVar85._16_4_;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar113._20_4_ = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * auVar85._20_4_;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar113._24_4_ = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * auVar85._24_4_;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar113._28_4_ = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * auVar85._28_4_;
        auVar141._8_4_ = 0xff800000;
        auVar141._0_8_ = 0xff800000ff800000;
        auVar141._12_4_ = 0xff800000;
        auVar141._16_4_ = 0xff800000;
        auVar141._20_4_ = 0xff800000;
        auVar141._24_4_ = 0xff800000;
        auVar141._28_4_ = 0xff800000;
        auVar81 = vblendmps_avx512vl(auVar141,auVar44);
        bVar64 = (bool)((byte)uVar65 & 1);
        auVar114._0_4_ = (uint)bVar64 * auVar81._0_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar114._16_4_ = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar114._20_4_ = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar114._24_4_ = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * -0x800000;
        bVar64 = SUB81(uVar65 >> 7,0);
        auVar114._28_4_ = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * -0x800000;
        vandps_avx512vl(auVar96,local_660);
        auVar81 = vmaxps_avx(local_4c0,auVar114);
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar112 = vmulps_avx512vl(auVar81,auVar33);
        vandps_avx512vl(auVar84,auVar96);
        uVar58 = vcmpps_avx512vl(auVar112,auVar112,1);
        uVar65 = uVar65 & uVar58;
        bVar59 = (byte)uVar65;
        if (bVar59 != 0) {
          uVar58 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar74),2);
          auVar236._8_4_ = 0xff800000;
          auVar236._0_8_ = 0xff800000ff800000;
          auVar236._12_4_ = 0xff800000;
          auVar236._16_4_ = 0xff800000;
          auVar236._20_4_ = 0xff800000;
          auVar236._24_4_ = 0xff800000;
          auVar236._28_4_ = 0xff800000;
          auVar253._8_4_ = 0x7f800000;
          auVar253._0_8_ = 0x7f8000007f800000;
          auVar253._12_4_ = 0x7f800000;
          auVar253._16_4_ = 0x7f800000;
          auVar253._20_4_ = 0x7f800000;
          auVar253._24_4_ = 0x7f800000;
          auVar253._28_4_ = 0x7f800000;
          auVar81 = vblendmps_avx512vl(auVar253,auVar236);
          bVar57 = (byte)uVar58;
          uVar66 = (uint)(bVar57 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar112._0_4_;
          bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
          uVar123 = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * auVar112._4_4_;
          bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
          uVar124 = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * auVar112._8_4_;
          bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
          uVar125 = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * auVar112._12_4_;
          bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
          uVar126 = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * auVar112._16_4_;
          bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
          uVar127 = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * auVar112._20_4_;
          bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
          uVar128 = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * auVar112._24_4_;
          bVar64 = SUB81(uVar58 >> 7,0);
          uVar129 = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * auVar112._28_4_;
          auVar113._0_4_ = (bVar59 & 1) * uVar66 | !(bool)(bVar59 & 1) * auVar113._0_4_;
          bVar64 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar113._4_4_ = bVar64 * uVar123 | !bVar64 * auVar113._4_4_;
          bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar113._8_4_ = bVar64 * uVar124 | !bVar64 * auVar113._8_4_;
          bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar113._12_4_ = bVar64 * uVar125 | !bVar64 * auVar113._12_4_;
          bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar113._16_4_ = bVar64 * uVar126 | !bVar64 * auVar113._16_4_;
          bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar113._20_4_ = bVar64 * uVar127 | !bVar64 * auVar113._20_4_;
          bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar113._24_4_ = bVar64 * uVar128 | !bVar64 * auVar113._24_4_;
          bVar64 = SUB81(uVar65 >> 7,0);
          auVar113._28_4_ = bVar64 * uVar129 | !bVar64 * auVar113._28_4_;
          auVar81 = vblendmps_avx512vl(auVar236,auVar253);
          bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar58 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar58 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar58 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar58 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar58 >> 6) & 1);
          bVar16 = SUB81(uVar58 >> 7,0);
          auVar112._0_4_ =
               (uint)(bVar59 & 1) *
               ((uint)(bVar57 & 1) * auVar81._0_4_ | !(bool)(bVar57 & 1) * uVar66) |
               !(bool)(bVar59 & 1) * auVar114._0_4_;
          bVar10 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar112._4_4_ =
               (uint)bVar10 * ((uint)bVar64 * auVar81._4_4_ | !bVar64 * uVar123) |
               !bVar10 * auVar114._4_4_;
          bVar64 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar112._8_4_ =
               (uint)bVar64 * ((uint)bVar11 * auVar81._8_4_ | !bVar11 * uVar124) |
               !bVar64 * auVar114._8_4_;
          bVar64 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar112._12_4_ =
               (uint)bVar64 * ((uint)bVar12 * auVar81._12_4_ | !bVar12 * uVar125) |
               !bVar64 * auVar114._12_4_;
          bVar64 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar112._16_4_ =
               (uint)bVar64 * ((uint)bVar13 * auVar81._16_4_ | !bVar13 * uVar126) |
               !bVar64 * auVar114._16_4_;
          bVar64 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar112._20_4_ =
               (uint)bVar64 * ((uint)bVar14 * auVar81._20_4_ | !bVar14 * uVar127) |
               !bVar64 * auVar114._20_4_;
          bVar64 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar112._24_4_ =
               (uint)bVar64 * ((uint)bVar15 * auVar81._24_4_ | !bVar15 * uVar128) |
               !bVar64 * auVar114._24_4_;
          bVar64 = SUB81(uVar65 >> 7,0);
          auVar112._28_4_ =
               (uint)bVar64 * ((uint)bVar16 * auVar81._28_4_ | !bVar16 * uVar129) |
               !bVar64 * auVar114._28_4_;
          bVar62 = (~bVar59 | bVar57) & bVar62;
          auVar114 = auVar112;
        }
      }
      uVar238 = *(undefined4 *)&(ray->dir).field_0;
      auVar233._4_4_ = uVar238;
      auVar233._0_4_ = uVar238;
      auVar233._8_4_ = uVar238;
      auVar233._12_4_ = uVar238;
      auVar233._16_4_ = uVar238;
      auVar233._20_4_ = uVar238;
      auVar233._24_4_ = uVar238;
      auVar233._28_4_ = uVar238;
      uVar238 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar237._4_4_ = uVar238;
      auVar237._0_4_ = uVar238;
      auVar237._8_4_ = uVar238;
      auVar237._12_4_ = uVar238;
      auVar237._16_4_ = uVar238;
      auVar237._20_4_ = uVar238;
      auVar237._24_4_ = uVar238;
      auVar237._28_4_ = uVar238;
      fVar243 = (ray->dir).field_0.m128[2];
      auVar254 = ZEXT3264(CONCAT428(fVar243,CONCAT424(fVar243,CONCAT420(fVar243,CONCAT416(fVar243,
                                                  CONCAT412(fVar243,CONCAT48(fVar243,CONCAT44(
                                                  fVar243,fVar243))))))));
      auVar229._0_4_ = fVar243 * auVar211._0_4_;
      auVar229._4_4_ = fVar243 * auVar211._4_4_;
      auVar229._8_4_ = fVar243 * auVar211._8_4_;
      auVar229._12_4_ = fVar243 * auVar211._12_4_;
      auVar229._16_4_ = fVar243 * auVar211._16_4_;
      auVar229._20_4_ = fVar243 * auVar211._20_4_;
      auVar229._28_36_ = auVar211._28_36_;
      auVar229._24_4_ = fVar243 * auVar211._24_4_;
      auVar75 = vfmadd231ps_fma(auVar229._0_32_,auVar237,auVar80);
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar233,auVar95);
      auVar252 = ZEXT3264(_local_5a0);
      _local_440 = _local_5a0;
      local_420 = vminps_avx(local_3e0,auVar113);
      vandps_avx512vl(ZEXT1632(auVar75),auVar96);
      _local_580 = vmaxps_avx(_local_5a0,auVar114);
      auVar229 = ZEXT3264(_local_580);
      _local_400 = _local_580;
      auVar142._8_4_ = 0x3e99999a;
      auVar142._0_8_ = 0x3e99999a3e99999a;
      auVar142._12_4_ = 0x3e99999a;
      auVar142._16_4_ = 0x3e99999a;
      auVar142._20_4_ = 0x3e99999a;
      auVar142._24_4_ = 0x3e99999a;
      auVar142._28_4_ = 0x3e99999a;
      uVar19 = vcmpps_avx512vl(auVar112,auVar142,1);
      local_7f4 = (undefined4)uVar19;
      uVar19 = vcmpps_avx512vl(_local_5a0,local_420,2);
      bVar59 = (byte)uVar19 & bVar56;
      uVar20 = vcmpps_avx512vl(_local_580,local_3e0,2);
      if ((bVar56 & ((byte)uVar20 | (byte)uVar19)) == 0) {
        auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
      else {
        auVar46._4_4_ = auVar244._4_4_ * fVar243;
        auVar46._0_4_ = auVar244._0_4_ * fVar243;
        auVar46._8_4_ = auVar244._8_4_ * fVar243;
        auVar46._12_4_ = auVar244._12_4_ * fVar243;
        auVar46._16_4_ = auVar244._16_4_ * fVar243;
        auVar46._20_4_ = auVar244._20_4_ * fVar243;
        auVar46._24_4_ = auVar244._24_4_ * fVar243;
        auVar46._28_4_ = 0x3e99999a;
        auVar75 = vfmadd213ps_fma(auVar86,auVar237,auVar46);
        auVar75 = vfmadd213ps_fma(auVar97,auVar233,ZEXT1632(auVar75));
        vandps_avx512vl(ZEXT1632(auVar75),auVar96);
        uVar19 = vcmpps_avx512vl(auVar112,auVar142,1);
        local_7fc = (uint)(byte)~bVar62;
        bVar62 = (byte)uVar19 | ~bVar62;
        auVar143._8_4_ = 2;
        auVar143._0_8_ = 0x200000002;
        auVar143._12_4_ = 2;
        auVar143._16_4_ = 2;
        auVar143._20_4_ = 2;
        auVar143._24_4_ = 2;
        auVar143._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar80 = vpblendmd_avx512vl(auVar143,auVar34);
        local_3c0._0_4_ = (uint)(bVar62 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        local_3c0._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        local_3c0._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 3 & 1);
        local_3c0._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 4 & 1);
        local_3c0._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 5 & 1);
        local_3c0._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 6 & 1);
        local_3c0._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 2;
        local_3c0._28_4_ = (uint)(bVar62 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
        local_4e0 = vpbroadcastd_avx512vl();
        uVar19 = vpcmpd_avx512vl(local_4e0,local_3c0,5);
        local_7f8 = (uint)bVar59;
        bVar59 = (byte)uVar19 & bVar59;
        if (bVar59 == 0) {
          auVar216._8_4_ = 0x7fffffff;
          auVar216._0_8_ = 0x7fffffff7fffffff;
          auVar216._12_4_ = 0x7fffffff;
        }
        else {
          auVar74 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar75 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar68 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar17 = vminps_avx(auVar74,auVar68);
          auVar74 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar68 = vmaxps_avx(auVar75,auVar74);
          auVar180._8_4_ = 0x7fffffff;
          auVar180._0_8_ = 0x7fffffff7fffffff;
          auVar180._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar17,auVar180);
          auVar74 = vandps_avx(auVar68,auVar180);
          auVar75 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmovshdup_avx(auVar75);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          fVar230 = auVar75._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar68,auVar68,0xff);
          local_560 = (float)local_5a0._0_4_ + (float)local_740._0_4_;
          fStack_55c = (float)local_5a0._4_4_ + (float)local_740._4_4_;
          fStack_558 = fStack_598 + fStack_738;
          fStack_554 = fStack_594 + fStack_734;
          fStack_550 = fStack_590 + fStack_730;
          fStack_54c = fStack_58c + fStack_72c;
          fStack_548 = fStack_588 + fStack_728;
          fStack_544 = fStack_584 + fStack_724;
          do {
            auVar82 = local_8a0;
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar80 = vblendmps_avx512vl(auVar144,_local_5a0);
            auVar115._0_4_ =
                 (uint)(bVar59 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 1 & 1);
            auVar115._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 2 & 1);
            auVar115._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 3 & 1);
            auVar115._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 4 & 1);
            auVar115._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 5 & 1);
            auVar115._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 6 & 1);
            auVar115._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar115._28_4_ =
                 (uint)(bVar59 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
            auVar80 = vshufps_avx(auVar115,auVar115,0xb1);
            auVar80 = vminps_avx(auVar115,auVar80);
            auVar81 = vshufpd_avx(auVar80,auVar80,5);
            auVar80 = vminps_avx(auVar80,auVar81);
            auVar81 = vpermpd_avx2(auVar80,0x4e);
            auVar80 = vminps_avx(auVar80,auVar81);
            uVar19 = vcmpps_avx512vl(auVar115,auVar80,0);
            bVar57 = (byte)uVar19 & bVar59;
            bVar62 = bVar59;
            if (bVar57 != 0) {
              bVar62 = bVar57;
            }
            iVar22 = 0;
            for (uVar66 = (uint)bVar62; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            auVar252 = ZEXT464(*(uint *)(local_520 + (uint)(iVar22 << 2)));
            auVar241 = ZEXT464(*(uint *)(local_440 + (uint)(iVar22 << 2)));
            aVar2 = (ray->dir).field_0;
            local_660._0_16_ = (undefined1  [16])aVar2;
            auVar75 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_520 + (uint)(iVar22 << 2)));
              local_860._0_16_ = ZEXT416(*(uint *)(local_440 + (uint)(iVar22 << 2)));
              local_8a0[1] = 0;
              local_8a0[0] = bVar59;
              local_8a0._2_30_ = auVar82._2_30_;
              fVar242 = sqrtf(auVar75._0_4_);
              bVar59 = local_8a0[0];
              auVar241 = ZEXT1664(local_860._0_16_);
              auVar252 = ZEXT1664(local_8c0._0_16_);
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar242 = auVar75._0_4_;
            }
            lVar63 = 5;
            do {
              local_860._0_16_ = auVar241._0_16_;
              uVar238 = auVar241._0_4_;
              auVar134._4_4_ = uVar238;
              auVar134._0_4_ = uVar238;
              auVar134._8_4_ = uVar238;
              auVar134._12_4_ = uVar238;
              auVar75 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_660._0_16_);
              fVar175 = auVar252._0_4_;
              fVar200 = 1.0 - fVar175;
              fVar249 = fVar200 * fVar200 * fVar200;
              fVar245 = fVar175 * fVar175;
              fVar224 = fVar175 * fVar245;
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar249),
                                        ZEXT416((uint)fVar224));
              fVar247 = fVar175 * fVar200;
              local_8a0._0_16_ = ZEXT416((uint)fVar200);
              auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar175 * fVar247 * 6.0)),
                                        ZEXT416((uint)(fVar247 * fVar200)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                        ZEXT416((uint)fVar249));
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * fVar200 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar175 * fVar247)));
              fVar249 = fVar249 * 0.16666667;
              fVar200 = (auVar74._0_4_ + auVar17._0_4_) * 0.16666667;
              fVar175 = (auVar68._0_4_ + auVar77._0_4_) * 0.16666667;
              fVar224 = fVar224 * 0.16666667;
              auVar181._0_4_ = fVar224 * (float)local_6e0._0_4_;
              auVar181._4_4_ = fVar224 * (float)local_6e0._4_4_;
              auVar181._8_4_ = fVar224 * fStack_6d8;
              auVar181._12_4_ = fVar224 * fStack_6d4;
              auVar215._4_4_ = fVar175;
              auVar215._0_4_ = fVar175;
              auVar215._8_4_ = fVar175;
              auVar215._12_4_ = fVar175;
              auVar74 = vfmadd132ps_fma(auVar215,auVar181,local_6a0._0_16_);
              auVar182._4_4_ = fVar200;
              auVar182._0_4_ = fVar200;
              auVar182._8_4_ = fVar200;
              auVar182._12_4_ = fVar200;
              auVar74 = vfmadd132ps_fma(auVar182,auVar74,local_6c0._0_16_);
              auVar158._4_4_ = fVar249;
              auVar158._0_4_ = fVar249;
              auVar158._8_4_ = fVar249;
              auVar158._12_4_ = fVar249;
              local_5c0 = vfmadd132ps_fma(auVar158,auVar74,local_680._0_16_);
              auVar75 = vsubps_avx(auVar75,local_5c0);
              local_700._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_8c0._0_16_ = auVar252._0_16_;
              local_720._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar245;
                auVar254._0_4_ = sqrtf(auVar75._0_4_);
                auVar254._4_60_ = extraout_var;
                auVar75 = auVar254._0_16_;
                auVar74 = local_8c0._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                local_7c0._0_4_ = fVar245;
                auVar74 = auVar252._0_16_;
              }
              local_5d0 = local_8a0._0_4_;
              auVar68 = vfnmsub213ss_fma(auVar74,auVar74,ZEXT416((uint)(fVar247 * 4.0)));
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar247 * 4.0)),local_8a0._0_16_,
                                        local_8a0._0_16_);
              fVar245 = local_5d0 * -local_5d0 * 0.5;
              fVar247 = auVar68._0_4_ * 0.5;
              fVar249 = auVar74._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar202._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
              auVar202._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
              auVar202._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
              auVar202._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
              auVar159._4_4_ = fVar249;
              auVar159._0_4_ = fVar249;
              auVar159._8_4_ = fVar249;
              auVar159._12_4_ = fVar249;
              auVar74 = vfmadd132ps_fma(auVar159,auVar202,local_6a0._0_16_);
              auVar183._4_4_ = fVar247;
              auVar183._0_4_ = fVar247;
              auVar183._8_4_ = fVar247;
              auVar183._12_4_ = fVar247;
              auVar74 = vfmadd132ps_fma(auVar183,auVar74,local_6c0._0_16_);
              auVar256._4_4_ = fVar245;
              auVar256._0_4_ = fVar245;
              auVar256._8_4_ = fVar245;
              auVar256._12_4_ = fVar245;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar256,auVar74,local_680._0_16_);
              local_5e0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              auVar48._12_4_ = 0;
              auVar48._0_12_ = ZEXT812(0);
              fVar245 = local_5e0._0_4_;
              local_820 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar245));
              fVar247 = local_820._0_4_;
              local_5f0 = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar245));
              auVar74 = vfnmadd213ss_fma(local_5f0,local_5e0,ZEXT416(0x40000000));
              uVar66 = auVar75._0_4_;
              fStack_5cc = local_5d0;
              fStack_5c8 = local_5d0;
              fStack_5c4 = local_5d0;
              if (fVar245 < -fVar245) {
                local_830._0_4_ = fVar245 * -0.5;
                fVar249 = sqrtf(fVar245);
                auVar75 = ZEXT416(uVar66);
                fVar245 = (float)local_830._0_4_;
                auVar68 = local_7c0._0_16_;
              }
              else {
                auVar68 = vsqrtss_avx(local_5e0,local_5e0);
                fVar249 = auVar68._0_4_;
                fVar245 = fVar245 * -0.5;
                auVar68 = local_7c0._0_16_;
              }
              fVar200 = local_820._0_4_;
              fVar245 = fVar247 * 1.5 + fVar245 * fVar200 * fVar200 * fVar200;
              local_820._0_4_ = auVar68._0_4_ * fVar245;
              local_820._4_4_ = auVar68._4_4_ * fVar245;
              local_820._8_4_ = auVar68._8_4_ * fVar245;
              local_820._12_4_ = auVar68._12_4_ * fVar245;
              auVar17 = vdpps_avx(local_700._0_16_,local_820,0x7f);
              fVar200 = auVar75._0_4_;
              auVar135._0_4_ = auVar17._0_4_ * auVar17._0_4_;
              auVar135._4_4_ = auVar17._4_4_ * auVar17._4_4_;
              auVar135._8_4_ = auVar17._8_4_ * auVar17._8_4_;
              auVar135._12_4_ = auVar17._12_4_ * auVar17._12_4_;
              auVar69 = vsubps_avx512vl(local_720._0_16_,auVar135);
              fVar247 = auVar69._0_4_;
              auVar160._4_12_ = ZEXT812(0) << 0x20;
              auVar160._0_4_ = fVar247;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160);
              auVar76 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar78 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar247 < 0.0) {
                local_830 = auVar17;
                local_610 = fVar245;
                fStack_60c = fVar245;
                fStack_608 = fVar245;
                fStack_604 = fVar245;
                local_600 = auVar77;
                fVar247 = sqrtf(fVar247);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416(uVar66);
                auVar68 = local_7c0._0_16_;
                auVar17 = local_830;
                auVar77 = local_600;
                fVar245 = local_610;
                fVar175 = fStack_60c;
                fVar224 = fStack_608;
                fVar243 = fStack_604;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar247 = auVar69._0_4_;
                fVar175 = fVar245;
                fVar224 = fVar245;
                fVar243 = fVar245;
              }
              auVar258 = ZEXT1664(auVar68);
              auVar244 = ZEXT1664(local_700._0_16_);
              auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar261 = ZEXT3264(auVar80);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,
                                        local_8c0._0_16_);
              auVar69 = vfmadd231ss_fma(local_8a0._0_16_,local_8c0._0_16_,
                                        SUB6416(ZEXT464(0xc0000000),0));
              fVar248 = local_8c0._0_4_;
              auVar184._0_4_ = fVar248 * (float)local_6e0._0_4_;
              auVar184._4_4_ = fVar248 * (float)local_6e0._4_4_;
              auVar184._8_4_ = fVar248 * fStack_6d8;
              auVar184._12_4_ = fVar248 * fStack_6d4;
              auVar203._0_4_ = auVar69._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar69 = vfmadd132ps_fma(auVar203,auVar184,local_6a0._0_16_);
              auVar161._0_4_ = auVar70._0_4_;
              auVar161._4_4_ = auVar161._0_4_;
              auVar161._8_4_ = auVar161._0_4_;
              auVar161._12_4_ = auVar161._0_4_;
              auVar69 = vfmadd132ps_fma(auVar161,auVar69,local_6c0._0_16_);
              auVar50._4_4_ = fStack_5cc;
              auVar50._0_4_ = local_5d0;
              auVar50._8_4_ = fStack_5c8;
              auVar50._12_4_ = fStack_5c4;
              auVar69 = vfmadd132ps_fma(auVar50,auVar69,local_680._0_16_);
              auVar162._0_4_ = auVar69._0_4_ * (float)local_5e0._0_4_;
              auVar162._4_4_ = auVar69._4_4_ * (float)local_5e0._0_4_;
              auVar162._8_4_ = auVar69._8_4_ * (float)local_5e0._0_4_;
              auVar162._12_4_ = auVar69._12_4_ * (float)local_5e0._0_4_;
              auVar69 = vdpps_avx(auVar68,auVar69,0x7f);
              fVar246 = auVar69._0_4_;
              auVar185._0_4_ = auVar68._0_4_ * fVar246;
              auVar185._4_4_ = auVar68._4_4_ * fVar246;
              auVar185._8_4_ = auVar68._8_4_ * fVar246;
              auVar185._12_4_ = auVar68._12_4_ * fVar246;
              auVar70 = vsubps_avx(auVar162,auVar185);
              fVar246 = auVar74._0_4_ * (float)local_5f0._0_4_;
              auVar69 = vmaxss_avx(ZEXT416((uint)fVar230),
                                   ZEXT416((uint)((float)local_860._0_4_ * fVar242 * 1.9073486e-06))
                                  );
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar117._16_16_ = auVar80._16_16_;
              auVar79 = vxorps_avx512vl(auVar68,auVar28);
              auVar186._0_4_ = fVar245 * auVar70._0_4_ * fVar246;
              auVar186._4_4_ = fVar175 * auVar70._4_4_ * fVar246;
              auVar186._8_4_ = fVar224 * auVar70._8_4_ * fVar246;
              auVar186._12_4_ = fVar243 * auVar70._12_4_ * fVar246;
              auVar254 = ZEXT1664(local_820);
              auVar74 = vdpps_avx(auVar79,local_820,0x7f);
              auVar70 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar230),auVar69);
              auVar75 = vdpps_avx(local_700._0_16_,auVar186,0x7f);
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(fVar200 + 1.0)),
                                        ZEXT416((uint)(fVar230 / fVar249)),auVar70);
              auVar259 = ZEXT1664(auVar70);
              fVar245 = auVar74._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_660._0_16_,local_820,0x7f);
              auVar74 = vdpps_avx(local_700._0_16_,auVar79,0x7f);
              auVar78 = vmulss_avx512f(auVar78,auVar77);
              auVar79 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar78._0_4_ *
                                                             auVar77._0_4_ * auVar77._0_4_)));
              auVar77 = vdpps_avx(local_700._0_16_,local_660._0_16_,0x7f);
              auVar76 = vfnmadd231ss_fma(auVar74,auVar17,ZEXT416((uint)fVar245));
              auVar78 = vfnmadd231ss_fma(auVar77,auVar17,auVar75);
              auVar74 = vpermilps_avx(local_5c0,0xff);
              fVar247 = fVar247 - auVar74._0_4_;
              auVar74 = vshufps_avx(auVar68,auVar68,0xff);
              auVar77 = vfmsub213ss_fma(auVar76,auVar79,auVar74);
              fVar249 = auVar78._0_4_ * auVar79._0_4_;
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar245),ZEXT416((uint)fVar249));
              fVar200 = auVar76._0_4_;
              fVar249 = auVar17._0_4_ * (fVar249 / fVar200) - fVar247 * (auVar75._0_4_ / fVar200);
              auVar229 = ZEXT464((uint)fVar249);
              fVar248 = fVar248 - fVar249;
              auVar252 = ZEXT464((uint)fVar248);
              fVar245 = (float)local_860._0_4_ -
                        (fVar247 * (fVar245 / fVar200) - auVar17._0_4_ * (auVar77._0_4_ / fVar200));
              auVar241 = ZEXT464((uint)fVar245);
              auVar216._8_4_ = 0x7fffffff;
              auVar216._0_8_ = 0x7fffffff7fffffff;
              auVar216._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx(auVar17,auVar216);
              bVar64 = true;
              if (auVar75._0_4_ < auVar70._0_4_) {
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ + auVar69._0_4_)),local_630,
                                          ZEXT416(0x36000000));
                auVar75 = vandps_avx(ZEXT416((uint)fVar247),auVar216);
                if (auVar75._0_4_ < auVar17._0_4_) {
                  fVar245 = fVar245 + (float)local_620._0_4_;
                  auVar241 = ZEXT464((uint)fVar245);
                  if ((ray->org).field_0.m128[3] <= fVar245) {
                    fVar247 = ray->tfar;
                    auVar229 = ZEXT464((uint)fVar247);
                    if (((fVar245 <= fVar247) && (0.0 <= fVar248)) && (fVar248 <= 1.0)) {
                      auVar117._0_16_ = ZEXT816(0) << 0x20;
                      auVar116._4_28_ = auVar117._4_28_;
                      auVar116._0_4_ = local_720._0_4_;
                      auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar116._0_16_);
                      fVar249 = auVar75._0_4_;
                      auVar75 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
                      pGVar5 = (context->scene->geometries).items[local_868].ptr;
                      if ((pGVar5->mask & ray->mask) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R13B = 1;
                        }
                        else {
                          fVar249 = fVar249 * 1.5 + auVar75._0_4_ * fVar249 * fVar249 * fVar249;
                          auVar163._0_4_ = local_700._0_4_ * fVar249;
                          auVar163._4_4_ = local_700._4_4_ * fVar249;
                          auVar163._8_4_ = local_700._8_4_ * fVar249;
                          auVar163._12_4_ = local_700._12_4_ * fVar249;
                          auVar77 = vfmadd213ps_fma(auVar74,auVar163,auVar68);
                          auVar75 = vshufps_avx(auVar163,auVar163,0xc9);
                          auVar74 = vshufps_avx(auVar68,auVar68,0xc9);
                          auVar164._0_4_ = auVar163._0_4_ * auVar74._0_4_;
                          auVar164._4_4_ = auVar163._4_4_ * auVar74._4_4_;
                          auVar164._8_4_ = auVar163._8_4_ * auVar74._8_4_;
                          auVar164._12_4_ = auVar163._12_4_ * auVar74._12_4_;
                          auVar17 = vfmsub231ps_fma(auVar164,auVar68,auVar75);
                          auVar75 = vshufps_avx(auVar17,auVar17,0xc9);
                          auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                          auVar17 = vshufps_avx(auVar17,auVar17,0xd2);
                          auVar136._0_4_ = auVar77._0_4_ * auVar17._0_4_;
                          auVar136._4_4_ = auVar77._4_4_ * auVar17._4_4_;
                          auVar136._8_4_ = auVar77._8_4_ * auVar17._8_4_;
                          auVar136._12_4_ = auVar77._12_4_ * auVar17._12_4_;
                          auVar74 = vfmsub231ps_fma(auVar136,auVar75,auVar74);
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          local_790 = vmovlps_avx(auVar75);
                          local_788 = auVar74._0_4_;
                          local_780 = 0;
                          local_77c = (undefined4)local_748;
                          local_778 = (undefined4)local_868;
                          local_774 = context->user->instID[0];
                          local_770 = context->user->instPrimID[0];
                          ray->tfar = fVar245;
                          local_8c4 = -1;
                          local_7f0.valid = &local_8c4;
                          local_7f0.geometryUserPtr = pGVar5->userPtr;
                          local_7f0.context = context->user;
                          local_7f0.hit = (RTCHitN *)&local_790;
                          local_7f0.N = 1;
                          local_8c0._0_16_ = ZEXT416((uint)fVar248);
                          local_860._0_16_ = ZEXT416((uint)fVar245);
                          local_8a0._0_4_ = fVar247;
                          local_7f0.ray = (RTCRayN *)ray;
                          local_784 = fVar248;
                          if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c31a01:
                            p_Var9 = context->args->filter;
                            if (p_Var9 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                auVar244 = ZEXT1664(auVar244._0_16_);
                                auVar254 = ZEXT1664(auVar254._0_16_);
                                auVar258 = ZEXT1664(auVar258._0_16_);
                                auVar259 = ZEXT1664(auVar259._0_16_);
                                (*p_Var9)(&local_7f0);
                                auVar229 = ZEXT464((uint)local_8a0._0_4_);
                                auVar241 = ZEXT1664(local_860._0_16_);
                                auVar252 = ZEXT1664(local_8c0._0_16_);
                                auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar261 = ZEXT3264(auVar80);
                                auVar216._8_4_ = 0x7fffffff;
                                auVar216._0_8_ = 0x7fffffff7fffffff;
                                auVar216._12_4_ = 0x7fffffff;
                              }
                              if (*local_7f0.valid == 0) goto LAB_01c31a66;
                            }
                            unaff_R13B = 1;
                          }
                          else {
                            auVar244 = ZEXT1664(local_700._0_16_);
                            auVar254 = ZEXT1664(local_820);
                            auVar258 = ZEXT1664(auVar68);
                            auVar259 = ZEXT1664(auVar70);
                            (*pGVar5->occlusionFilterN)(&local_7f0);
                            auVar229 = ZEXT464((uint)local_8a0._0_4_);
                            auVar241 = ZEXT1664(local_860._0_16_);
                            auVar252 = ZEXT1664(local_8c0._0_16_);
                            auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar261 = ZEXT3264(auVar80);
                            auVar216._8_4_ = 0x7fffffff;
                            auVar216._0_8_ = 0x7fffffff7fffffff;
                            auVar216._12_4_ = 0x7fffffff;
                            if (*local_7f0.valid != 0) goto LAB_01c31a01;
LAB_01c31a66:
                            unaff_R13B = 0;
                          }
                          if (unaff_R13B == 0) {
                            ray->tfar = auVar229._0_4_;
                          }
                        }
                        bVar64 = false;
                        goto LAB_01c31886;
                      }
                    }
                  }
                  bVar64 = false;
                  unaff_R13B = 0;
                }
              }
LAB_01c31886:
              if (!bVar64) goto LAB_01c31a89;
              lVar63 = lVar63 + -1;
            } while (lVar63 != 0);
            unaff_R13B = 0;
            auVar216._8_4_ = 0x7fffffff;
            auVar216._0_8_ = 0x7fffffff7fffffff;
            auVar216._12_4_ = 0x7fffffff;
LAB_01c31a89:
            unaff_R13B = unaff_R13B & 1;
            bVar60 = bVar60 | unaff_R13B;
            auVar52._4_4_ = fStack_55c;
            auVar52._0_4_ = local_560;
            auVar52._8_4_ = fStack_558;
            auVar52._12_4_ = fStack_554;
            auVar52._16_4_ = fStack_550;
            auVar52._20_4_ = fStack_54c;
            auVar52._24_4_ = fStack_548;
            auVar52._28_4_ = fStack_544;
            fVar242 = ray->tfar;
            auVar35._4_4_ = fVar242;
            auVar35._0_4_ = fVar242;
            auVar35._8_4_ = fVar242;
            auVar35._12_4_ = fVar242;
            auVar35._16_4_ = fVar242;
            auVar35._20_4_ = fVar242;
            auVar35._24_4_ = fVar242;
            auVar35._28_4_ = fVar242;
            uVar19 = vcmpps_avx512vl(auVar52,auVar35,2);
            bVar59 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar59 & (byte)uVar19;
          } while (bVar59 != 0);
        }
        auVar145._0_4_ = (float)local_740._0_4_ + (float)local_580._0_4_;
        auVar145._4_4_ = (float)local_740._4_4_ + (float)local_580._4_4_;
        auVar145._8_4_ = fStack_738 + fStack_578;
        auVar145._12_4_ = fStack_734 + fStack_574;
        auVar145._16_4_ = fStack_730 + fStack_570;
        auVar145._20_4_ = fStack_72c + fStack_56c;
        auVar145._24_4_ = fStack_728 + fStack_568;
        auVar145._28_4_ = fStack_724 + fStack_564;
        fVar230 = ray->tfar;
        auVar36._4_4_ = fVar230;
        auVar36._0_4_ = fVar230;
        auVar36._8_4_ = fVar230;
        auVar36._12_4_ = fVar230;
        auVar36._16_4_ = fVar230;
        auVar36._20_4_ = fVar230;
        auVar36._24_4_ = fVar230;
        auVar36._28_4_ = fVar230;
        uVar19 = vcmpps_avx512vl(auVar145,auVar36,2);
        bVar62 = (byte)local_7f4 | (byte)local_7fc;
        bVar56 = (byte)uVar20 & bVar56 & (byte)uVar19;
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar80 = vpblendmd_avx512vl(auVar146,auVar37);
        local_580._0_4_ = (uint)(bVar62 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
        bVar64 = (bool)(bVar62 >> 1 & 1);
        local_580._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 2;
        bVar64 = (bool)(bVar62 >> 2 & 1);
        fStack_578 = (float)((uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar62 >> 3 & 1);
        fStack_574 = (float)((uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar62 >> 4 & 1);
        fStack_570 = (float)((uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar62 >> 5 & 1);
        fStack_56c = (float)((uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 2);
        bVar64 = (bool)(bVar62 >> 6 & 1);
        fStack_568 = (float)((uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 2);
        fStack_564 = (float)((uint)(bVar62 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2);
        uVar19 = vpcmpd_avx512vl(_local_580,local_4e0,2);
        bVar62 = (byte)uVar19 & bVar56;
        fVar230 = (float)local_740._0_4_;
        fVar242 = (float)local_740._4_4_;
        fVar245 = fStack_738;
        fVar247 = fStack_734;
        fVar249 = fStack_730;
        fVar200 = fStack_72c;
        fVar175 = fStack_728;
        fVar224 = fStack_724;
        if (bVar62 != 0) {
          auVar74 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar75 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
          auVar68 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar17 = vminps_avx(auVar74,auVar68);
          auVar74 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
          auVar68 = vmaxps_avx(auVar75,auVar74);
          auVar75 = vandps_avx(auVar17,auVar216);
          auVar74 = vandps_avx(auVar68,auVar216);
          auVar75 = vmaxps_avx(auVar75,auVar74);
          auVar74 = vmovshdup_avx(auVar75);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          fVar243 = auVar75._0_4_ * 1.9073486e-06;
          local_630 = vshufps_avx(auVar68,auVar68,0xff);
          _local_5a0 = _local_400;
          local_560 = (float)local_740._0_4_ + (float)local_400._0_4_;
          fStack_55c = (float)local_740._4_4_ + (float)local_400._4_4_;
          fStack_558 = fStack_738 + fStack_3f8;
          fStack_554 = fStack_734 + fStack_3f4;
          fStack_550 = fStack_730 + fStack_3f0;
          fStack_54c = fStack_72c + fStack_3ec;
          fStack_548 = fStack_728 + fStack_3e8;
          fStack_544 = fStack_724 + fStack_3e4;
          do {
            auVar82 = local_8a0;
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar80 = vblendmps_avx512vl(auVar147,_local_5a0);
            auVar118._0_4_ =
                 (uint)(bVar62 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 1 & 1);
            auVar118._4_4_ = (uint)bVar64 * auVar80._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 2 & 1);
            auVar118._8_4_ = (uint)bVar64 * auVar80._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 3 & 1);
            auVar118._12_4_ = (uint)bVar64 * auVar80._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 4 & 1);
            auVar118._16_4_ = (uint)bVar64 * auVar80._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 5 & 1);
            auVar118._20_4_ = (uint)bVar64 * auVar80._20_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar62 >> 6 & 1);
            auVar118._24_4_ = (uint)bVar64 * auVar80._24_4_ | (uint)!bVar64 * 0x7f800000;
            auVar118._28_4_ =
                 (uint)(bVar62 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar62 >> 7) * 0x7f800000;
            auVar80 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar80 = vminps_avx(auVar118,auVar80);
            auVar81 = vshufpd_avx(auVar80,auVar80,5);
            auVar80 = vminps_avx(auVar80,auVar81);
            auVar81 = vpermpd_avx2(auVar80,0x4e);
            auVar80 = vminps_avx(auVar80,auVar81);
            uVar19 = vcmpps_avx512vl(auVar118,auVar80,0);
            bVar57 = (byte)uVar19 & bVar62;
            bVar59 = bVar62;
            if (bVar57 != 0) {
              bVar59 = bVar57;
            }
            iVar22 = 0;
            for (uVar66 = (uint)bVar59; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            auVar252 = ZEXT464(*(uint *)(local_540 + (uint)(iVar22 << 2)));
            auVar241 = ZEXT464(*(uint *)(local_3e0 + (uint)(iVar22 << 2)));
            aVar2 = (ray->dir).field_0;
            local_660._0_16_ = (undefined1  [16])aVar2;
            auVar75 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar22 << 2)));
              local_860._0_16_ = ZEXT416(*(uint *)(local_3e0 + (uint)(iVar22 << 2)));
              local_8a0[1] = 0;
              local_8a0[0] = bVar62;
              local_8a0._2_30_ = auVar82._2_30_;
              fVar246 = sqrtf(auVar75._0_4_);
              bVar62 = local_8a0[0];
              auVar241 = ZEXT1664(local_860._0_16_);
              auVar252 = ZEXT1664(local_8c0._0_16_);
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar246 = auVar75._0_4_;
            }
            lVar63 = 5;
            do {
              local_860._0_16_ = auVar241._0_16_;
              uVar238 = auVar241._0_4_;
              auVar137._4_4_ = uVar238;
              auVar137._0_4_ = uVar238;
              auVar137._8_4_ = uVar238;
              auVar137._12_4_ = uVar238;
              auVar75 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_660._0_16_);
              fVar249 = auVar252._0_4_;
              fVar247 = 1.0 - fVar249;
              fVar245 = fVar247 * fVar247 * fVar247;
              fVar230 = fVar249 * fVar249;
              fVar200 = fVar249 * fVar230;
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                        ZEXT416((uint)fVar200));
              fVar242 = fVar249 * fVar247;
              local_8a0._0_16_ = ZEXT416((uint)fVar247);
              auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * fVar242 * 6.0)),
                                        ZEXT416((uint)(fVar242 * fVar247)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar200),
                                        ZEXT416((uint)fVar245));
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * fVar247 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar249 * fVar242)));
              fVar245 = fVar245 * 0.16666667;
              fVar247 = (auVar74._0_4_ + auVar17._0_4_) * 0.16666667;
              fVar249 = (auVar68._0_4_ + auVar77._0_4_) * 0.16666667;
              fVar200 = fVar200 * 0.16666667;
              auVar187._0_4_ = fVar200 * (float)local_6e0._0_4_;
              auVar187._4_4_ = fVar200 * (float)local_6e0._4_4_;
              auVar187._8_4_ = fVar200 * fStack_6d8;
              auVar187._12_4_ = fVar200 * fStack_6d4;
              auVar217._4_4_ = fVar249;
              auVar217._0_4_ = fVar249;
              auVar217._8_4_ = fVar249;
              auVar217._12_4_ = fVar249;
              auVar74 = vfmadd132ps_fma(auVar217,auVar187,local_6a0._0_16_);
              auVar188._4_4_ = fVar247;
              auVar188._0_4_ = fVar247;
              auVar188._8_4_ = fVar247;
              auVar188._12_4_ = fVar247;
              auVar74 = vfmadd132ps_fma(auVar188,auVar74,local_6c0._0_16_);
              auVar165._4_4_ = fVar245;
              auVar165._0_4_ = fVar245;
              auVar165._8_4_ = fVar245;
              auVar165._12_4_ = fVar245;
              local_5c0 = vfmadd132ps_fma(auVar165,auVar74,local_680._0_16_);
              auVar75 = vsubps_avx(auVar75,local_5c0);
              local_700._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_8c0._0_16_ = auVar252._0_16_;
              local_720._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                local_7c0._0_4_ = fVar230;
                auVar258._0_4_ = sqrtf(auVar75._0_4_);
                auVar258._4_60_ = extraout_var_00;
                auVar75 = auVar258._0_16_;
                auVar74 = local_8c0._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                local_7c0._0_4_ = fVar230;
                auVar74 = auVar252._0_16_;
              }
              local_5d0 = local_8a0._0_4_;
              auVar68 = vfnmsub213ss_fma(auVar74,auVar74,ZEXT416((uint)(fVar242 * 4.0)));
              auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar242 * 4.0)),local_8a0._0_16_,
                                        local_8a0._0_16_);
              fVar230 = local_5d0 * -local_5d0 * 0.5;
              fVar242 = auVar68._0_4_ * 0.5;
              fVar245 = auVar74._0_4_ * 0.5;
              local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
              auVar204._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
              auVar204._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
              auVar204._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
              auVar204._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
              auVar166._4_4_ = fVar245;
              auVar166._0_4_ = fVar245;
              auVar166._8_4_ = fVar245;
              auVar166._12_4_ = fVar245;
              auVar74 = vfmadd132ps_fma(auVar166,auVar204,local_6a0._0_16_);
              auVar189._4_4_ = fVar242;
              auVar189._0_4_ = fVar242;
              auVar189._8_4_ = fVar242;
              auVar189._12_4_ = fVar242;
              auVar74 = vfmadd132ps_fma(auVar189,auVar74,local_6c0._0_16_);
              auVar257._4_4_ = fVar230;
              auVar257._0_4_ = fVar230;
              auVar257._8_4_ = fVar230;
              auVar257._12_4_ = fVar230;
              local_7c0._0_16_ = vfmadd132ps_fma(auVar257,auVar74,local_680._0_16_);
              local_5e0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
              auVar49._12_4_ = 0;
              auVar49._0_12_ = ZEXT812(0);
              fVar230 = local_5e0._0_4_;
              local_820 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar230));
              fVar242 = local_820._0_4_;
              local_5f0 = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar230));
              auVar74 = vfnmadd213ss_fma(local_5f0,local_5e0,ZEXT416(0x40000000));
              uVar66 = auVar75._0_4_;
              fStack_5cc = local_5d0;
              fStack_5c8 = local_5d0;
              fStack_5c4 = local_5d0;
              if (fVar230 < -fVar230) {
                local_830._0_4_ = fVar230 * -0.5;
                fVar245 = sqrtf(fVar230);
                auVar75 = ZEXT416(uVar66);
                fVar230 = (float)local_830._0_4_;
                auVar68 = local_7c0._0_16_;
              }
              else {
                auVar68 = vsqrtss_avx(local_5e0,local_5e0);
                fVar245 = auVar68._0_4_;
                fVar230 = fVar230 * -0.5;
                auVar68 = local_7c0._0_16_;
              }
              fVar247 = local_820._0_4_;
              fVar230 = fVar242 * 1.5 + fVar230 * fVar247 * fVar247 * fVar247;
              local_820._0_4_ = auVar68._0_4_ * fVar230;
              local_820._4_4_ = auVar68._4_4_ * fVar230;
              local_820._8_4_ = auVar68._8_4_ * fVar230;
              local_820._12_4_ = auVar68._12_4_ * fVar230;
              auVar17 = vdpps_avx(local_700._0_16_,local_820,0x7f);
              fVar247 = auVar75._0_4_;
              auVar138._0_4_ = auVar17._0_4_ * auVar17._0_4_;
              auVar138._4_4_ = auVar17._4_4_ * auVar17._4_4_;
              auVar138._8_4_ = auVar17._8_4_ * auVar17._8_4_;
              auVar138._12_4_ = auVar17._12_4_ * auVar17._12_4_;
              auVar69 = vsubps_avx512vl(local_720._0_16_,auVar138);
              fVar242 = auVar69._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar242;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar76 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar78 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar242 < 0.0) {
                local_830 = auVar17;
                local_610 = fVar230;
                fStack_60c = fVar230;
                fStack_608 = fVar230;
                fStack_604 = fVar230;
                local_600 = auVar77;
                fVar248 = sqrtf(fVar242);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416(uVar66);
                auVar68 = local_7c0._0_16_;
                auVar17 = local_830;
                auVar77 = local_600;
                fVar230 = local_610;
                fVar242 = fStack_60c;
                fVar249 = fStack_608;
                fVar200 = fStack_604;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar248 = auVar69._0_4_;
                fVar242 = fVar230;
                fVar249 = fVar230;
                fVar200 = fVar230;
              }
              auVar258 = ZEXT1664(auVar68);
              auVar244 = ZEXT1664(local_700._0_16_);
              auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar261 = ZEXT3264(auVar80);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,
                                        local_8c0._0_16_);
              auVar69 = vfmadd231ss_fma(local_8a0._0_16_,local_8c0._0_16_,
                                        SUB6416(ZEXT464(0xc0000000),0));
              fVar251 = local_8c0._0_4_;
              auVar190._0_4_ = fVar251 * (float)local_6e0._0_4_;
              auVar190._4_4_ = fVar251 * (float)local_6e0._4_4_;
              auVar190._8_4_ = fVar251 * fStack_6d8;
              auVar190._12_4_ = fVar251 * fStack_6d4;
              auVar205._0_4_ = auVar69._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar69 = vfmadd132ps_fma(auVar205,auVar190,local_6a0._0_16_);
              auVar168._0_4_ = auVar70._0_4_;
              auVar168._4_4_ = auVar168._0_4_;
              auVar168._8_4_ = auVar168._0_4_;
              auVar168._12_4_ = auVar168._0_4_;
              auVar69 = vfmadd132ps_fma(auVar168,auVar69,local_6c0._0_16_);
              auVar51._4_4_ = fStack_5cc;
              auVar51._0_4_ = local_5d0;
              auVar51._8_4_ = fStack_5c8;
              auVar51._12_4_ = fStack_5c4;
              auVar69 = vfmadd132ps_fma(auVar51,auVar69,local_680._0_16_);
              auVar169._0_4_ = auVar69._0_4_ * (float)local_5e0._0_4_;
              auVar169._4_4_ = auVar69._4_4_ * (float)local_5e0._0_4_;
              auVar169._8_4_ = auVar69._8_4_ * (float)local_5e0._0_4_;
              auVar169._12_4_ = auVar69._12_4_ * (float)local_5e0._0_4_;
              auVar69 = vdpps_avx(auVar68,auVar69,0x7f);
              fVar175 = auVar69._0_4_;
              auVar191._0_4_ = auVar68._0_4_ * fVar175;
              auVar191._4_4_ = auVar68._4_4_ * fVar175;
              auVar191._8_4_ = auVar68._8_4_ * fVar175;
              auVar191._12_4_ = auVar68._12_4_ * fVar175;
              auVar70 = vsubps_avx(auVar169,auVar191);
              fVar175 = auVar74._0_4_ * (float)local_5f0._0_4_;
              auVar69 = vmaxss_avx(ZEXT416((uint)fVar243),
                                   ZEXT416((uint)((float)local_860._0_4_ * fVar246 * 1.9073486e-06))
                                  );
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar120._16_16_ = auVar80._16_16_;
              auVar79 = vxorps_avx512vl(auVar68,auVar29);
              auVar192._0_4_ = fVar230 * auVar70._0_4_ * fVar175;
              auVar192._4_4_ = fVar242 * auVar70._4_4_ * fVar175;
              auVar192._8_4_ = fVar249 * auVar70._8_4_ * fVar175;
              auVar192._12_4_ = fVar200 * auVar70._12_4_ * fVar175;
              auVar254 = ZEXT1664(local_820);
              auVar74 = vdpps_avx(auVar79,local_820,0x7f);
              auVar70 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar243),auVar69);
              auVar75 = vdpps_avx(local_700._0_16_,auVar192,0x7f);
              auVar70 = vfmadd213ss_fma(ZEXT416((uint)(fVar247 + 1.0)),
                                        ZEXT416((uint)(fVar243 / fVar245)),auVar70);
              auVar259 = ZEXT1664(auVar70);
              fVar230 = auVar74._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_660._0_16_,local_820,0x7f);
              auVar74 = vdpps_avx(local_700._0_16_,auVar79,0x7f);
              auVar78 = vmulss_avx512f(auVar78,auVar77);
              auVar79 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar78._0_4_ *
                                                             auVar77._0_4_ * auVar77._0_4_)));
              auVar77 = vdpps_avx(local_700._0_16_,local_660._0_16_,0x7f);
              auVar76 = vfnmadd231ss_fma(auVar74,auVar17,ZEXT416((uint)fVar230));
              auVar78 = vfnmadd231ss_fma(auVar77,auVar17,auVar75);
              auVar74 = vpermilps_avx(local_5c0,0xff);
              fVar248 = fVar248 - auVar74._0_4_;
              auVar74 = vshufps_avx(auVar68,auVar68,0xff);
              auVar77 = vfmsub213ss_fma(auVar76,auVar79,auVar74);
              fVar242 = auVar78._0_4_ * auVar79._0_4_;
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar230),ZEXT416((uint)fVar242));
              fVar245 = auVar76._0_4_;
              fVar242 = auVar17._0_4_ * (fVar242 / fVar245) - fVar248 * (auVar75._0_4_ / fVar245);
              auVar229 = ZEXT464((uint)fVar242);
              fVar251 = fVar251 - fVar242;
              auVar252 = ZEXT464((uint)fVar251);
              fVar250 = (float)local_860._0_4_ -
                        (fVar248 * (fVar230 / fVar245) - auVar17._0_4_ * (auVar77._0_4_ / fVar245));
              auVar241 = ZEXT464((uint)fVar250);
              auVar218._8_4_ = 0x7fffffff;
              auVar218._0_8_ = 0x7fffffff7fffffff;
              auVar218._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx(auVar17,auVar218);
              bVar64 = true;
              fVar230 = (float)local_740._0_4_;
              fVar242 = (float)local_740._4_4_;
              fVar245 = fStack_738;
              fVar247 = fStack_734;
              fVar249 = fStack_730;
              fVar200 = fStack_72c;
              fVar175 = fStack_728;
              fVar224 = fStack_724;
              if (auVar75._0_4_ < auVar70._0_4_) {
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ + auVar69._0_4_)),local_630,
                                          ZEXT416(0x36000000));
                auVar75 = vandps_avx(ZEXT416((uint)fVar248),auVar218);
                if (auVar75._0_4_ < auVar17._0_4_) {
                  fVar250 = fVar250 + (float)local_620._0_4_;
                  auVar241 = ZEXT464((uint)fVar250);
                  if ((ray->org).field_0.m128[3] <= fVar250) {
                    fVar248 = ray->tfar;
                    auVar229 = ZEXT464((uint)fVar248);
                    if (((fVar250 <= fVar248) && (0.0 <= fVar251)) && (fVar251 <= 1.0)) {
                      auVar120._0_16_ = ZEXT816(0) << 0x20;
                      auVar119._4_28_ = auVar120._4_28_;
                      auVar119._0_4_ = local_720._0_4_;
                      auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar119._0_16_);
                      fVar255 = auVar75._0_4_;
                      auVar75 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
                      pGVar5 = (context->scene->geometries).items[local_868].ptr;
                      if ((pGVar5->mask & ray->mask) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_R13B = 1;
                        }
                        else {
                          fVar230 = fVar255 * 1.5 + auVar75._0_4_ * fVar255 * fVar255 * fVar255;
                          auVar170._0_4_ = local_700._0_4_ * fVar230;
                          auVar170._4_4_ = local_700._4_4_ * fVar230;
                          auVar170._8_4_ = local_700._8_4_ * fVar230;
                          auVar170._12_4_ = local_700._12_4_ * fVar230;
                          auVar77 = vfmadd213ps_fma(auVar74,auVar170,auVar68);
                          auVar75 = vshufps_avx(auVar170,auVar170,0xc9);
                          auVar74 = vshufps_avx(auVar68,auVar68,0xc9);
                          auVar171._0_4_ = auVar170._0_4_ * auVar74._0_4_;
                          auVar171._4_4_ = auVar170._4_4_ * auVar74._4_4_;
                          auVar171._8_4_ = auVar170._8_4_ * auVar74._8_4_;
                          auVar171._12_4_ = auVar170._12_4_ * auVar74._12_4_;
                          auVar17 = vfmsub231ps_fma(auVar171,auVar68,auVar75);
                          auVar75 = vshufps_avx(auVar17,auVar17,0xc9);
                          auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                          auVar17 = vshufps_avx(auVar17,auVar17,0xd2);
                          auVar139._0_4_ = auVar77._0_4_ * auVar17._0_4_;
                          auVar139._4_4_ = auVar77._4_4_ * auVar17._4_4_;
                          auVar139._8_4_ = auVar77._8_4_ * auVar17._8_4_;
                          auVar139._12_4_ = auVar77._12_4_ * auVar17._12_4_;
                          auVar74 = vfmsub231ps_fma(auVar139,auVar75,auVar74);
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          local_790 = vmovlps_avx(auVar75);
                          local_788 = auVar74._0_4_;
                          local_780 = 0;
                          local_77c = (undefined4)local_748;
                          local_778 = (undefined4)local_868;
                          local_774 = context->user->instID[0];
                          local_770 = context->user->instPrimID[0];
                          ray->tfar = fVar250;
                          local_8c4 = -1;
                          local_7f0.valid = &local_8c4;
                          local_7f0.geometryUserPtr = pGVar5->userPtr;
                          local_7f0.context = context->user;
                          local_7f0.hit = (RTCHitN *)&local_790;
                          local_7f0.N = 1;
                          local_8c0._0_16_ = ZEXT416((uint)fVar251);
                          local_860._0_16_ = ZEXT416((uint)fVar250);
                          local_8a0._0_4_ = fVar248;
                          local_7f0.ray = (RTCRayN *)ray;
                          local_784 = fVar251;
                          if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c32463:
                            p_Var9 = context->args->filter;
                            fVar230 = (float)local_740._0_4_;
                            fVar242 = (float)local_740._4_4_;
                            fVar245 = fStack_738;
                            fVar247 = fStack_734;
                            fVar249 = fStack_730;
                            fVar200 = fStack_72c;
                            fVar175 = fStack_728;
                            fVar224 = fStack_724;
                            if (p_Var9 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                auVar244 = ZEXT1664(auVar244._0_16_);
                                auVar254 = ZEXT1664(auVar254._0_16_);
                                auVar258 = ZEXT1664(auVar258._0_16_);
                                auVar259 = ZEXT1664(auVar259._0_16_);
                                (*p_Var9)(&local_7f0);
                                auVar229 = ZEXT464((uint)local_8a0._0_4_);
                                auVar241 = ZEXT1664(local_860._0_16_);
                                auVar252 = ZEXT1664(local_8c0._0_16_);
                                auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar261 = ZEXT3264(auVar80);
                                fVar230 = (float)local_740._0_4_;
                                fVar242 = (float)local_740._4_4_;
                                fVar245 = fStack_738;
                                fVar247 = fStack_734;
                                fVar249 = fStack_730;
                                fVar200 = fStack_72c;
                                fVar175 = fStack_728;
                                fVar224 = fStack_724;
                              }
                              if (*local_7f0.valid == 0) goto LAB_01c324c8;
                            }
                            unaff_R13B = 1;
                          }
                          else {
                            auVar244 = ZEXT1664(local_700._0_16_);
                            auVar254 = ZEXT1664(local_820);
                            auVar258 = ZEXT1664(auVar68);
                            auVar259 = ZEXT1664(auVar70);
                            (*pGVar5->occlusionFilterN)(&local_7f0);
                            auVar229 = ZEXT464((uint)local_8a0._0_4_);
                            auVar241 = ZEXT1664(local_860._0_16_);
                            auVar252 = ZEXT1664(local_8c0._0_16_);
                            auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar261 = ZEXT3264(auVar80);
                            fVar230 = (float)local_740._0_4_;
                            fVar242 = (float)local_740._4_4_;
                            fVar245 = fStack_738;
                            fVar247 = fStack_734;
                            fVar249 = fStack_730;
                            fVar200 = fStack_72c;
                            fVar175 = fStack_728;
                            fVar224 = fStack_724;
                            if (*local_7f0.valid != 0) goto LAB_01c32463;
LAB_01c324c8:
                            unaff_R13B = 0;
                          }
                          if (unaff_R13B == 0) {
                            ray->tfar = auVar229._0_4_;
                          }
                        }
                        bVar64 = false;
                        goto LAB_01c322e8;
                      }
                    }
                  }
                  bVar64 = false;
                  unaff_R13B = 0;
                }
              }
LAB_01c322e8:
              if (!bVar64) goto LAB_01c324e2;
              lVar63 = lVar63 + -1;
            } while (lVar63 != 0);
            unaff_R13B = 0;
LAB_01c324e2:
            unaff_R13B = unaff_R13B & 1;
            bVar60 = bVar60 | unaff_R13B;
            auVar53._4_4_ = fStack_55c;
            auVar53._0_4_ = local_560;
            auVar53._8_4_ = fStack_558;
            auVar53._12_4_ = fStack_554;
            auVar53._16_4_ = fStack_550;
            auVar53._20_4_ = fStack_54c;
            auVar53._24_4_ = fStack_548;
            auVar53._28_4_ = fStack_544;
            fVar246 = ray->tfar;
            auVar38._4_4_ = fVar246;
            auVar38._0_4_ = fVar246;
            auVar38._8_4_ = fVar246;
            auVar38._12_4_ = fVar246;
            auVar38._16_4_ = fVar246;
            auVar38._20_4_ = fVar246;
            auVar38._24_4_ = fVar246;
            auVar38._28_4_ = fVar246;
            uVar19 = vcmpps_avx512vl(auVar53,auVar38,2);
            bVar62 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar62 & (byte)uVar19;
          } while (bVar62 != 0);
        }
        uVar20 = vpcmpd_avx512vl(local_4e0,_local_580,1);
        uVar21 = vpcmpd_avx512vl(local_4e0,local_3c0,1);
        auVar172._0_4_ = fVar230 + (float)local_440._0_4_;
        auVar172._4_4_ = fVar242 + (float)local_440._4_4_;
        auVar172._8_4_ = fVar245 + fStack_438;
        auVar172._12_4_ = fVar247 + fStack_434;
        auVar172._16_4_ = fVar249 + fStack_430;
        auVar172._20_4_ = fVar200 + fStack_42c;
        auVar172._24_4_ = fVar175 + fStack_428;
        auVar172._28_4_ = fVar224 + fStack_424;
        fVar243 = ray->tfar;
        auVar193._4_4_ = fVar243;
        auVar193._0_4_ = fVar243;
        auVar193._8_4_ = fVar243;
        auVar193._12_4_ = fVar243;
        auVar193._16_4_ = fVar243;
        auVar193._20_4_ = fVar243;
        auVar193._24_4_ = fVar243;
        auVar193._28_4_ = fVar243;
        uVar19 = vcmpps_avx512vl(auVar172,auVar193,2);
        bVar62 = (byte)local_7f8 & (byte)uVar21 & (byte)uVar19;
        auVar210._0_4_ = fVar230 + (float)local_400._0_4_;
        auVar210._4_4_ = fVar242 + (float)local_400._4_4_;
        auVar210._8_4_ = fVar245 + fStack_3f8;
        auVar210._12_4_ = fVar247 + fStack_3f4;
        auVar210._16_4_ = fVar249 + fStack_3f0;
        auVar210._20_4_ = fVar200 + fStack_3ec;
        auVar210._24_4_ = fVar175 + fStack_3e8;
        auVar210._28_4_ = fVar224 + fStack_3e4;
        uVar19 = vcmpps_avx512vl(auVar210,auVar193,2);
        bVar56 = bVar56 & (byte)uVar20 & (byte)uVar19 | bVar62;
        prim = local_758;
        if (bVar56 == 0) {
          auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          uVar65 = local_808 & 0xffffffff;
          abStack_180[uVar65 * 0x60] = bVar56;
          auVar121._0_4_ =
               (uint)(bVar62 & 1) * local_440._0_4_ | (uint)!(bool)(bVar62 & 1) * local_400._0_4_;
          bVar64 = (bool)(bVar62 >> 1 & 1);
          auVar121._4_4_ = (uint)bVar64 * local_440._4_4_ | (uint)!bVar64 * local_400._4_4_;
          bVar64 = (bool)(bVar62 >> 2 & 1);
          auVar121._8_4_ = (uint)bVar64 * (int)fStack_438 | (uint)!bVar64 * (int)fStack_3f8;
          bVar64 = (bool)(bVar62 >> 3 & 1);
          auVar121._12_4_ = (uint)bVar64 * (int)fStack_434 | (uint)!bVar64 * (int)fStack_3f4;
          bVar64 = (bool)(bVar62 >> 4 & 1);
          auVar121._16_4_ = (uint)bVar64 * (int)fStack_430 | (uint)!bVar64 * (int)fStack_3f0;
          bVar64 = (bool)(bVar62 >> 5 & 1);
          auVar121._20_4_ = (uint)bVar64 * (int)fStack_42c | (uint)!bVar64 * (int)fStack_3ec;
          bVar64 = (bool)(bVar62 >> 6 & 1);
          auVar121._24_4_ = (uint)bVar64 * (int)fStack_428 | (uint)!bVar64 * (int)fStack_3e8;
          auVar121._28_4_ =
               (uint)(bVar62 >> 7) * (int)fStack_424 | (uint)!(bool)(bVar62 >> 7) * (int)fStack_3e4;
          *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x60) = auVar121;
          uVar19 = vmovlps_avx(local_640);
          *(undefined8 *)(afStack_140 + uVar65 * 0x18) = uVar19;
          auStack_138[uVar65 * 0x18] = (int)local_750 + 1;
          local_808 = (ulong)((int)local_808 + 1);
          auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
      }
    }
    fVar243 = ray->tfar;
    auVar148._4_4_ = fVar243;
    auVar148._0_4_ = fVar243;
    auVar148._8_4_ = fVar243;
    auVar148._12_4_ = fVar243;
    auVar148._16_4_ = fVar243;
    auVar148._20_4_ = fVar243;
    auVar148._24_4_ = fVar243;
    auVar148._28_4_ = fVar243;
    uVar65 = local_808;
    do {
      if ((int)uVar65 == 0) {
        if (bVar60 != 0) {
          return local_8f1;
        }
        fVar230 = ray->tfar;
        auVar30._4_4_ = fVar230;
        auVar30._0_4_ = fVar230;
        auVar30._8_4_ = fVar230;
        auVar30._12_4_ = fVar230;
        uVar19 = vcmpps_avx512vl(local_4f0,auVar30,2);
        uVar66 = (uint)uVar19 & (uint)local_5a8 - 1 & (uint)local_5a8;
        local_5a8 = (ulong)uVar66;
        local_8f1 = uVar66 != 0;
        if (!local_8f1) {
          return local_8f1;
        }
        goto LAB_01c302c5;
      }
      uVar58 = (ulong)((int)uVar65 - 1);
      lVar63 = uVar58 * 0x60;
      auVar80 = *(undefined1 (*) [32])(auStack_160 + lVar63);
      auVar194._0_4_ = fVar230 + auVar80._0_4_;
      auVar194._4_4_ = fVar242 + auVar80._4_4_;
      auVar194._8_4_ = fVar245 + auVar80._8_4_;
      auVar194._12_4_ = fVar247 + auVar80._12_4_;
      auVar194._16_4_ = fVar249 + auVar80._16_4_;
      auVar194._20_4_ = fVar200 + auVar80._20_4_;
      auVar194._24_4_ = fVar175 + auVar80._24_4_;
      auVar194._28_4_ = fVar224 + auVar80._28_4_;
      uVar19 = vcmpps_avx512vl(auVar194,auVar148,2);
      uVar66 = (uint)uVar19 & (uint)abStack_180[lVar63];
      bVar56 = (byte)uVar66;
      local_808 = uVar58;
      if (uVar66 != 0) {
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar81 = vblendmps_avx512vl(auVar195,auVar80);
        auVar122._0_4_ =
             (uint)(bVar56 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar80._0_4_;
        bVar64 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * (int)auVar80._4_4_;
        bVar64 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * (int)auVar80._8_4_;
        bVar64 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * (int)auVar80._12_4_;
        bVar64 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * (int)auVar80._16_4_;
        bVar64 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * (int)auVar80._20_4_;
        bVar64 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * (int)auVar80._24_4_;
        auVar122._28_4_ =
             (uVar66 >> 7) * auVar81._28_4_ | (uint)!SUB41(uVar66 >> 7,0) * (int)auVar80._28_4_;
        auVar80 = vshufps_avx(auVar122,auVar122,0xb1);
        auVar80 = vminps_avx(auVar122,auVar80);
        auVar81 = vshufpd_avx(auVar80,auVar80,5);
        auVar80 = vminps_avx(auVar80,auVar81);
        auVar81 = vpermpd_avx2(auVar80,0x4e);
        auVar80 = vminps_avx(auVar80,auVar81);
        uVar19 = vcmpps_avx512vl(auVar122,auVar80,0);
        bVar62 = (byte)uVar19 & bVar56;
        if (bVar62 != 0) {
          uVar66 = (uint)bVar62;
        }
        fVar243 = afStack_140[uVar58 * 0x18 + 1];
        uVar123 = 0;
        for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
          uVar123 = uVar123 + 1;
        }
        local_750 = (ulong)auStack_138[uVar58 * 0x18];
        bVar62 = ~('\x01' << ((byte)uVar123 & 0x1f)) & bVar56;
        abStack_180[lVar63] = bVar62;
        auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar62 != 0) {
          local_808 = uVar65 & 0xffffffff;
        }
        fVar246 = afStack_140[uVar58 * 0x18];
        auVar196._4_4_ = fVar246;
        auVar196._0_4_ = fVar246;
        auVar196._8_4_ = fVar246;
        auVar196._12_4_ = fVar246;
        auVar196._16_4_ = fVar246;
        auVar196._20_4_ = fVar246;
        auVar196._24_4_ = fVar246;
        auVar196._28_4_ = fVar246;
        fVar243 = fVar243 - fVar246;
        auVar173._4_4_ = fVar243;
        auVar173._0_4_ = fVar243;
        auVar173._8_4_ = fVar243;
        auVar173._12_4_ = fVar243;
        auVar173._16_4_ = fVar243;
        auVar173._20_4_ = fVar243;
        auVar173._24_4_ = fVar243;
        auVar173._28_4_ = fVar243;
        auVar75 = vfmadd132ps_fma(auVar173,auVar196,_DAT_02020f20);
        _local_440 = ZEXT1632(auVar75);
        local_640._8_8_ = 0;
        local_640._0_8_ = *(ulong *)(local_440 + (ulong)uVar123 * 4);
      }
      uVar65 = local_808;
    } while (bVar56 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }